

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_tree(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  xmlNodePtr pxVar53;
  xmlBufferPtr pxVar54;
  xmlDocPtr pxVar55;
  xmlAttrPtr pxVar56;
  long lVar57;
  undefined8 uVar58;
  xmlDocPtr pxVar59;
  xmlDocPtr pxVar60;
  xmlNodePtr pxVar61;
  FILE *pFVar62;
  char *pcVar63;
  xmlNodePtr pxVar64;
  xmlNodePtr val;
  undefined4 uVar65;
  xmlChar *pxVar66;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int nr_03;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int nr_04;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int nr_05;
  int nr_06;
  int nr_07;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int extraout_EDX_37;
  int extraout_EDX_38;
  int extraout_EDX_39;
  int extraout_EDX_40;
  int extraout_EDX_41;
  int extraout_EDX_42;
  int nr_19;
  int nr_20;
  int extraout_EDX_43;
  int extraout_EDX_44;
  int nr_21;
  int nr_22;
  int nr_23;
  int test_ret_9;
  undefined4 *puVar67;
  xmlNs *pxVar68;
  undefined *puVar69;
  bool bVar70;
  bool bVar71;
  int n_node;
  uint uVar72;
  int iVar73;
  uint uVar74;
  int iVar75;
  ulong uVar76;
  xmlDocPtr in_RSI;
  undefined8 uVar77;
  undefined4 uVar78;
  int n_cur;
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  int n_string;
  uint uVar82;
  int iVar83;
  int test_ret_14;
  uint *puVar84;
  char *pcVar85;
  int n_str;
  undefined8 *puVar86;
  int *piVar87;
  xmlDocPtr pxVar88;
  undefined1 auVar89 [12];
  int test_ret;
  int test_ret_2;
  int test_ret_27;
  int test_ret_1;
  int test_ret_5;
  int test_ret_28;
  int test_ret_17;
  int test_ret_4;
  int test_ret_3;
  
  if (quiet == '\0') {
    puts("Testing tree : 146 of 172 functions ...");
  }
  uVar72 = 0;
  iVar22 = 0;
  do {
    uVar79 = 0;
    do {
      iVar3 = (int)in_RSI;
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar3);
      if (uVar79 == 0) {
        uVar58 = xmlNewPI("test",0);
      }
      else {
        uVar58 = 0;
      }
      pxVar53 = (xmlNodePtr)xmlAddChild(in_RSI,uVar58);
      if (pxVar53 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar58);
        iVar3 = extraout_EDX_00;
      }
      else {
        desret_xmlNodePtr(pxVar53);
        iVar3 = extraout_EDX;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)in_RSI,iVar3);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChild",(ulong)(uint)(iVar3 - iVar2));
        iVar22 = iVar22 + 1;
        printf(" %d",(ulong)uVar72);
        in_RSI = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar2 = 0;
  do {
    uVar79 = 0;
    do {
      iVar4 = (int)in_RSI;
      iVar3 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar4);
      if (uVar79 == 0) {
        uVar58 = xmlNewPI("test",0);
      }
      else {
        uVar58 = 0;
      }
      pxVar53 = (xmlNodePtr)xmlAddChildList(in_RSI,uVar58);
      if (pxVar53 == (xmlNodePtr)0x0) {
        xmlFreeNodeList(uVar58);
        iVar4 = extraout_EDX_02;
      }
      else {
        desret_xmlNodePtr(pxVar53);
        iVar4 = extraout_EDX_01;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)in_RSI,iVar4);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChildList",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar72);
        in_RSI = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar3 = 0;
  do {
    uVar79 = 0;
    do {
      iVar5 = (int)in_RSI;
      iVar4 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar5);
      if (uVar79 == 0) {
        uVar58 = xmlNewPI("test",0);
      }
      else {
        uVar58 = 0;
      }
      pxVar53 = (xmlNodePtr)xmlAddNextSibling(in_RSI,uVar58);
      if (pxVar53 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar58);
        iVar5 = extraout_EDX_04;
      }
      else {
        desret_xmlNodePtr(pxVar53);
        iVar5 = extraout_EDX_03;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)in_RSI,iVar5);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddNextSibling",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar72);
        in_RSI = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar4 = 0;
  do {
    uVar79 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar6);
      if (uVar79 == 0) {
        uVar58 = xmlNewPI("test",0);
      }
      else {
        uVar58 = 0;
      }
      pxVar53 = (xmlNodePtr)xmlAddPrevSibling(in_RSI,uVar58);
      if (pxVar53 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar58);
        iVar6 = extraout_EDX_06;
      }
      else {
        desret_xmlNodePtr(pxVar53);
        iVar6 = extraout_EDX_05;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)in_RSI,iVar6);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddPrevSibling",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar72);
        in_RSI = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_4 = 0;
  do {
    uVar79 = 0;
    do {
      iVar6 = (int)in_RSI;
      iVar5 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar6);
      if (uVar79 == 0) {
        uVar58 = xmlNewPI("test",0);
      }
      else {
        uVar58 = 0;
      }
      pxVar53 = (xmlNodePtr)xmlAddSibling(in_RSI,uVar58);
      if (pxVar53 == (xmlNodePtr)0x0) {
        xmlFreeNode(uVar58);
        iVar6 = extraout_EDX_08;
      }
      else {
        desret_xmlNodePtr(pxVar53);
        iVar6 = extraout_EDX_07;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)in_RSI,iVar6);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddSibling",(ulong)(uint)(iVar6 - iVar5));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar72);
        in_RSI = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      uVar80 = 0;
      bVar1 = true;
      do {
        bVar70 = bVar1;
        puVar86 = &DAT_0015ad60;
        pxVar88 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)in_RSI;
          iVar6 = xmlMemBlocks();
          pxVar54 = gen_xmlBufferPtr(uVar72,iVar7);
          pxVar55 = gen_xmlDocPtr(uVar79,iVar7);
          pxVar56 = gen_xmlAttrPtr(uVar80,iVar7);
          uVar82 = (uint)pxVar88;
          if (uVar82 < 4) {
            uVar58 = *puVar86;
          }
          else {
            uVar58 = 0;
          }
          in_RSI = pxVar55;
          xmlAttrSerializeTxtContent(pxVar54,pxVar55,pxVar56,uVar58);
          call_tests = call_tests + 1;
          if (pxVar54 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar54);
          }
          if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
            xmlFreeDoc(pxVar55);
          }
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAttrSerializeTxtContent",
                   (ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",(ulong)uVar79);
            printf(" %d",(ulong)uVar80);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar88;
          }
          uVar82 = uVar82 + 1;
          pxVar88 = (xmlDocPtr)(ulong)uVar82;
          puVar86 = puVar86 + 1;
        } while (uVar82 != 5);
        uVar80 = 1;
        bVar1 = false;
      } while (bVar70);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar57 = xmlBufContent(0);
  if (lVar57 != 0) {
    (*_xmlFree)(lVar57);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  lVar57 = xmlBufEnd(0);
  if (lVar57 != 0) {
    (*_xmlFree)(lVar57);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufEnd");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  pcVar63 = (char *)0x0;
  xmlBufGetNodeContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufGetNodeContent");
    printf(" %d");
    pcVar63 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar23 = 0;
  uVar72 = 0;
  do {
    iVar73 = 0;
    do {
      piVar87 = &DAT_00158240;
      uVar79 = 0;
      do {
        iVar14 = (int)pcVar63;
        iVar12 = xmlMemBlocks();
        pxVar54 = gen_xmlBufferPtr(uVar72,iVar14);
        switch(iVar73) {
        case 0:
          bVar1 = false;
          pcVar63 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar63 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar63 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar63 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar63 = (char *)0x0;
        }
        iVar14 = *piVar87;
        if ((!bVar1) && (iVar13 = xmlStrlen(pcVar63), iVar13 < iVar14)) {
          iVar14 = 0;
        }
        xmlBufferAdd(pxVar54,pcVar63,iVar14);
        call_tests = call_tests + 1;
        if (pxVar54 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar54);
        }
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar12 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAdd",(ulong)(uint)(iVar14 - iVar12));
          iVar23 = iVar23 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",iVar73);
          pcVar63 = (char *)(ulong)uVar79;
          printf(" %d");
          putchar(10);
        }
        uVar79 = uVar79 + 1;
        piVar87 = piVar87 + 1;
      } while (uVar79 != 4);
      iVar73 = iVar73 + 1;
    } while (iVar73 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar73 = 0;
  uVar72 = 0;
  do {
    iVar12 = 0;
    do {
      uVar79 = 0;
      piVar87 = &DAT_00158240;
      do {
        iVar13 = (int)pcVar63;
        iVar14 = xmlMemBlocks();
        pxVar54 = gen_xmlBufferPtr(uVar72,iVar13);
        switch(iVar12) {
        case 0:
          bVar1 = false;
          pcVar63 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar63 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar63 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar63 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar63 = (char *)0x0;
        }
        iVar13 = *piVar87;
        if ((!bVar1) && (iVar15 = xmlStrlen(pcVar63), iVar15 < iVar13)) {
          iVar13 = 0;
        }
        xmlBufferAddHead(pxVar54,pcVar63,iVar13);
        call_tests = call_tests + 1;
        if (pxVar54 != (xmlBufferPtr)0x0) {
          xmlBufferFree(pxVar54);
        }
        xmlResetLastError();
        iVar13 = xmlMemBlocks();
        if (iVar14 != iVar13) {
          iVar13 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAddHead",(ulong)(uint)(iVar13 - iVar14));
          iVar73 = iVar73 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",iVar12);
          pcVar63 = (char *)(ulong)uVar79;
          printf(" %d");
          putchar(10);
        }
        uVar79 = uVar79 + 1;
        piVar87 = piVar87 + 1;
      } while (uVar79 != 4);
      iVar12 = iVar12 + 1;
    } while (iVar12 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad48;
    pcVar85 = (char *)0x0;
    do {
      iVar13 = (int)pcVar63;
      iVar14 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar13);
      uVar79 = (uint)pcVar85;
      if (uVar79 < 3) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      xmlBufferCCat(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar14 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCCat",(ulong)(uint)(iVar13 - iVar14));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = pcVar85;
      }
      uVar79 = uVar79 + 1;
      pcVar85 = (char *)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pcVar85 = (char *)0x0;
    do {
      iVar15 = (int)pcVar63;
      iVar13 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar15);
      uVar79 = (uint)pcVar85;
      if (uVar79 < 4) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      xmlBufferCat(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar13 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCat",(ulong)(uint)(iVar15 - iVar13));
        iVar14 = iVar14 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = pcVar85;
      }
      uVar79 = uVar79 + 1;
      pcVar85 = (char *)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar13 = xmlMemBlocks();
  xmlBufferContent(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar13 != iVar15) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferContent");
    pcVar63 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  uVar58 = xmlBufferCreate();
  xmlBufferFree(uVar58);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar17 = xmlMemBlocks();
  if (iVar16 != iVar17) {
    iVar18 = xmlMemBlocks();
    pcVar63 = (char *)(ulong)(uint)(iVar18 - iVar16);
    printf("Leak of %d blocks found in xmlBufferCreate");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    pxVar54 = gen_xmlBufferPtr(uVar72,(int)pcVar63);
    lVar57 = xmlBufferDetach(pxVar54);
    if (lVar57 != 0) {
      (*_xmlFree)(lVar57);
    }
    call_tests = call_tests + 1;
    if (pxVar54 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar54);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferDetach",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar19 = 0;
  do {
    iVar20 = xmlMemBlocks();
    pxVar54 = gen_xmlBufferPtr(uVar72,(int)pcVar63);
    xmlBufferEmpty(pxVar54);
    call_tests = call_tests + 1;
    if (pxVar54 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar54);
    }
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferEmpty",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret = (int)(iVar16 != iVar17);
  iVar22 = iVar2 + iVar22 + iVar3 + iVar4 + test_ret_4 + iVar5 + (uint)(iVar6 != iVar7) +
           (uint)(iVar8 != iVar9) + (uint)(iVar10 != iVar11) + iVar23 + iVar73 + iVar12 + iVar14 +
           (uint)(iVar13 != iVar15) + test_ret;
  iVar2 = 0;
  uVar72 = 0;
  do {
    puVar84 = &DAT_0014c1ec;
    pcVar85 = (char *)0x0;
    do {
      iVar4 = (int)pcVar63;
      iVar3 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar4);
      pcVar63 = (char *)(ulong)*puVar84;
      xmlBufferGrow(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      iVar5 = (int)pcVar85;
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferGrow",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = pcVar85;
      }
      uVar79 = iVar5 + 1;
      pcVar85 = (char *)(ulong)uVar79;
      puVar84 = puVar84 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlBufferLength(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlBufferLength");
    pcVar63 = (char *)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar72 = 0;
  do {
    pcVar85 = (char *)0x0;
    puVar84 = &DAT_0014c1ec;
    do {
      iVar7 = (int)pcVar63;
      iVar6 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar7);
      pcVar63 = (char *)(ulong)*puVar84;
      xmlBufferResize(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      iVar8 = (int)pcVar85;
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferResize",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = pcVar85;
      }
      uVar79 = iVar8 + 1;
      pcVar85 = (char *)(ulong)uVar79;
      puVar84 = puVar84 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0xffffffff;
    do {
      iVar8 = (int)pcVar63;
      iVar7 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar8);
      pcVar63 = (char *)0x0;
      if (uVar79 < 3) {
        pcVar63 = (char *)(ulong)(uint)(&DAT_0014c1f8)[uVar79];
      }
      xmlBufferSetAllocationScheme(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      uVar79 = uVar79 + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferSetAllocationScheme",
               (ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar72);
        pcVar63 = (char *)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar72 = 0;
  do {
    puVar84 = &DAT_0014c1ec;
    uVar79 = 0;
    do {
      iVar9 = (int)pcVar63;
      iVar8 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar9);
      pcVar63 = (char *)(ulong)*puVar84;
      xmlBufferShrink(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferShrink",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar72);
        pcVar63 = (char *)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar84 = puVar84 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    uVar79 = 0;
    do {
      iVar9 = (int)pcVar63;
      iVar8 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar9);
      if (uVar79 < 4) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      xmlBufferWriteCHAR(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteCHAR",(ulong)(uint)(iVar9 - iVar8));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar72);
        pcVar63 = (char *)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad48;
    uVar79 = 0;
    do {
      iVar9 = (int)pcVar63;
      iVar8 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar9);
      if (uVar79 < 3) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      xmlBufferWriteChar(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteChar",(ulong)(uint)(iVar9 - iVar8));
        test_ret_17 = test_ret_17 + 1;
        printf(" %d",(ulong)uVar72);
        pcVar63 = (char *)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    uVar79 = 0;
    do {
      iVar10 = (int)pcVar63;
      iVar9 = xmlMemBlocks();
      pxVar54 = gen_xmlBufferPtr(uVar72,iVar10);
      if (uVar79 < 4) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      xmlBufferWriteQuotedString(pxVar54);
      call_tests = call_tests + 1;
      if (pxVar54 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar54);
      }
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteQuotedString",(ulong)(uint)(iVar10 - iVar9)
              );
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar72);
        pcVar63 = (char *)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar72 = 0;
  do {
    iVar9 = 0;
    do {
      _test_ret_3 = 0;
      bVar1 = true;
      do {
        bVar70 = bVar1;
        pxVar66 = (xmlChar *)0x0;
        if (bVar70) {
          pxVar66 = chartab;
        }
        piVar87 = &DAT_00158240;
        uVar79 = 0;
        do {
          iVar10 = xmlMemBlocks();
          if (uVar72 < 4) {
            pxVar88 = (xmlDocPtr)(&DAT_0015ad60)[uVar72];
          }
          else {
            pxVar88 = (xmlDocPtr)0x0;
          }
          switch(iVar9) {
          case 0:
            bVar1 = false;
            pcVar63 = "foo";
            break;
          case 1:
            bVar1 = false;
            pcVar63 = "<foo/>";
            break;
          case 2:
            bVar1 = false;
            pcVar63 = anon_var_dwarf_19f;
            break;
          case 3:
            bVar1 = false;
            pcVar63 = " 2ab ";
            break;
          default:
            bVar1 = true;
            pcVar63 = (char *)0x0;
          }
          iVar11 = *piVar87;
          if ((!bVar1) && (iVar23 = xmlStrlen(pcVar63), iVar23 < iVar11)) {
            iVar11 = 0;
          }
          pxVar55 = (xmlDocPtr)pcVar63;
          pxVar59 = (xmlDocPtr)xmlBuildQName(pxVar88,pcVar63,pxVar66,iVar11);
          if ((((pxVar59 != (xmlDocPtr)pxVar66) && (pxVar59 != (xmlDocPtr)pcVar63)) &&
              (pxVar59 != (xmlDocPtr)0x0)) && (pxVar59 != pxVar88)) {
            (*_xmlFree)(pxVar59);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar11 = xmlMemBlocks();
          if (iVar10 != iVar11) {
            iVar11 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBuildQName",(ulong)(uint)(iVar11 - iVar10));
            test_ret_4 = test_ret_4 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",iVar9);
            printf(" %d",_test_ret_3);
            pxVar55 = (xmlDocPtr)(ulong)uVar79;
            printf(" %d");
            putchar(10);
          }
          uVar79 = uVar79 + 1;
          piVar87 = piVar87 + 1;
        } while (uVar79 != 4);
        _test_ret_3 = 1;
        bVar1 = false;
      } while (bVar70);
      iVar9 = iVar9 + 1;
    } while (iVar9 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar9 = 0;
  do {
    iVar11 = (int)pxVar55;
    iVar10 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar11);
    xmlChildElementCount(pxVar55);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,nr);
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlChildElementCount",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar72 = 0;
  do {
    puVar84 = &DAT_00158240;
    pxVar88 = (xmlDocPtr)0x0;
    do {
      iVar23 = (int)pxVar55;
      iVar11 = xmlMemBlocks();
      pxVar59 = gen_xmlDocPtr(uVar72,iVar23);
      pxVar55 = (xmlDocPtr)(ulong)*puVar84;
      pxVar60 = (xmlDocPtr)xmlCopyDoc(pxVar59);
      if (api_doc != pxVar60) {
        xmlFreeDoc(pxVar60);
      }
      call_tests = call_tests + 1;
      if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
        xmlFreeDoc(pxVar59);
      }
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      iVar73 = (int)pxVar88;
      if (iVar11 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyDoc",(ulong)(uint)(iVar23 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar88;
      }
      uVar79 = iVar73 + 1;
      pxVar88 = (xmlDocPtr)(ulong)uVar79;
      puVar84 = puVar84 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar11 = 0;
  do {
    iVar73 = (int)pxVar55;
    iVar23 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlDtdPtr(uVar72,iVar73);
    pxVar53 = (xmlNodePtr)xmlCopyDtd(pxVar55);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    des_xmlDtdPtr(uVar72,(xmlDtdPtr)pxVar55,nr_00);
    xmlResetLastError();
    iVar73 = xmlMemBlocks();
    if (iVar23 != iVar73) {
      iVar73 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDtd",(ulong)(uint)(iVar73 - iVar23));
      iVar11 = iVar11 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_5 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    iVar23 = xmlMemBlocks();
    if (bVar70) {
      get_api_root();
      pxVar68 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        api_ns = api_root->nsDef;
        pxVar68 = api_ns;
      }
    }
    else {
      pxVar68 = (xmlNs *)0x0;
    }
    lVar57 = xmlCopyNamespace(pxVar68);
    if (lVar57 != 0) {
      xmlFreeNs();
    }
    call_tests = call_tests + 1;
    if (bVar70) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar73 = xmlMemBlocks();
    if (iVar23 != iVar73) {
      iVar73 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespace",(ulong)(uint)(iVar73 - iVar23));
      test_ret_5 = test_ret_5 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar23 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    iVar73 = xmlMemBlocks();
    if (bVar70) {
      get_api_root();
      pxVar68 = api_ns;
      if (api_root != (xmlNodePtr)0x0) {
        api_ns = api_root->nsDef;
        pxVar68 = api_ns;
      }
    }
    else {
      pxVar68 = (xmlNs *)0x0;
    }
    lVar57 = xmlCopyNamespaceList(pxVar68);
    if (lVar57 != 0) {
      xmlFreeNsList();
    }
    call_tests = call_tests + 1;
    if (bVar70) {
      xmlFreeDoc();
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar73 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespaceList",(ulong)(uint)(iVar12 - iVar73));
      iVar23 = iVar23 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar73 = 0;
  uVar72 = 0;
  do {
    pxVar88 = (xmlDocPtr)0x0;
    puVar67 = &DAT_00158240;
    do {
      iVar14 = (int)pxVar55;
      iVar12 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar14);
      pxVar53 = (xmlNodePtr)xmlCopyNode(pxVar55,*puVar67);
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,nr_01);
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      iVar13 = (int)pxVar88;
      if (iVar12 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyNode",(ulong)(uint)(iVar14 - iVar12));
        iVar73 = iVar73 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar88;
      }
      uVar79 = iVar13 + 1;
      pxVar88 = (xmlDocPtr)(ulong)uVar79;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_2 = 0;
  do {
    iVar14 = (int)pxVar55;
    iVar12 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar14);
    pxVar53 = (xmlNodePtr)xmlCopyNodeList(pxVar55);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,nr_02);
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar12 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNodeList",(ulong)(uint)(iVar14 - iVar12));
      test_ret_2 = test_ret_2 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar72 = 0;
  do {
    pxVar88 = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      iVar14 = (int)pxVar55;
      iVar13 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar14);
      pxVar56 = gen_xmlAttrPtr((int)pxVar88,iVar14);
      auVar89 = xmlCopyProp(pxVar55,pxVar56);
      iVar14 = auVar89._8_4_;
      lVar57 = auVar89._0_8_;
      if (lVar57 != 0) {
        xmlUnlinkNode(lVar57);
        xmlFreeNode(lVar57);
        iVar14 = extraout_EDX_09;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,iVar14);
      if (bVar70) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyProp",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar88;
      }
      pxVar88 = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret_28 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      iVar14 = (int)pxVar55;
      iVar13 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar14);
      pxVar56 = gen_xmlAttrPtr(uVar79,iVar14);
      auVar89 = xmlCopyPropList(pxVar55,pxVar56);
      iVar14 = auVar89._8_4_;
      lVar57 = auVar89._0_8_;
      if (lVar57 != 0) {
        xmlUnlinkNode(lVar57);
        xmlFreeNode(lVar57);
        iVar14 = extraout_EDX_10;
      }
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,iVar14);
      if (bVar70) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyPropList",(ulong)(uint)(iVar14 - iVar13));
        test_ret_28 = test_ret_28 + 1;
        printf(" %d",(ulong)uVar72);
        pxVar55 = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  iVar22 = test_ret_5 + iVar23 +
           test_ret_17 + iVar8 +
           iVar18 + iVar19 + iVar22 + iVar2 + (uint)(iVar3 != iVar4) + iVar5 + iVar6 + iVar7 +
           test_ret + test_ret_4 + iVar9 + iVar10 + iVar11 + iVar73 + test_ret_2;
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar88 = (xmlDocPtr)0x0;
        do {
          iVar3 = (int)pxVar55;
          iVar2 = xmlMemBlocks();
          pxVar59 = gen_xmlDocPtr(uVar72,iVar3);
          if (uVar79 < 4) {
            pxVar55 = (xmlDocPtr)(&DAT_0015ad60)[uVar79];
          }
          else {
            pxVar55 = (xmlDocPtr)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar80 = (uint)pxVar88;
          if (uVar80 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlCreateIntSubset(pxVar59,pxVar55,uVar58,uVar77);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
            xmlFreeDoc(pxVar59);
          }
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 != iVar3) {
            iVar3 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCreateIntSubset",(ulong)(uint)(iVar3 - iVar2));
            test_ret_2 = test_ret_2 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",(ulong)uVar79);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar88;
          }
          uVar80 = uVar80 + 1;
          pxVar88 = (xmlDocPtr)(ulong)uVar80;
          puVar86 = puVar86 + 1;
        } while (uVar80 != 5);
        uVar80 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar80;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar72 = 0;
  do {
    iVar2 = 0;
    do {
      uVar79 = 0;
      do {
        iVar3 = 0;
        do {
          pxVar88 = (xmlDocPtr)0x0;
          puVar67 = &DAT_00158240;
          do {
            iVar4 = (int)pxVar55;
            iVar5 = xmlMemBlocks();
            pxVar59 = gen_xmlDocPtr(uVar72,iVar4);
            pxVar61 = gen_xmlNodePtr(iVar2,iVar4);
            pxVar60 = gen_xmlDocPtr(uVar79,iVar4);
            pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar4);
            xmlDOMWrapAdoptNode(0,pxVar59,pxVar61,pxVar60,pxVar55,*puVar67);
            pxVar53 = (xmlNodePtr)0x0;
            iVar4 = extraout_EDX_11;
            if ((pxVar61 != (xmlNodePtr)0x0) &&
               (pxVar53 = pxVar61, pxVar61->parent == (_xmlNode *)0x0)) {
              xmlUnlinkNode(pxVar61);
              xmlFreeNode(pxVar61);
              pxVar53 = (xmlNodePtr)0x0;
              iVar4 = extraout_EDX_12;
            }
            call_tests = call_tests + 1;
            if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc))
            {
              xmlFreeDoc(pxVar59);
              iVar4 = extraout_EDX_13;
            }
            des_xmlNodePtr(iVar2,pxVar53,iVar4);
            iVar4 = extraout_EDX_14;
            if (((pxVar60 != (xmlDocPtr)0x0) && (api_doc != pxVar60)) && (pxVar60->doc != api_doc))
            {
              xmlFreeDoc(pxVar60);
              iVar4 = extraout_EDX_15;
            }
            des_xmlNodePtr(iVar3,(xmlNodePtr)pxVar55,iVar4);
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            iVar6 = (int)pxVar88;
            if (iVar5 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",(ulong)(uint)(iVar4 - iVar5));
              test_ret_4 = test_ret_4 + 1;
              printf(" %d",0);
              printf(" %d",(ulong)uVar72);
              printf(" %d",iVar2);
              printf(" %d",(ulong)uVar79);
              printf(" %d",iVar3);
              printf(" %d");
              putchar(10);
              pxVar55 = pxVar88;
            }
            uVar80 = iVar6 + 1;
            pxVar88 = (xmlDocPtr)(ulong)uVar80;
            puVar67 = puVar67 + 1;
          } while (uVar80 != 4);
          iVar3 = iVar3 + 1;
        } while (iVar3 != 3);
        uVar79 = uVar79 + 1;
      } while (uVar79 != 4);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar22 = test_ret_28 + test_ret_2 + iVar22 + iVar12 + test_ret_4;
  test_ret_4 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      uVar80 = 0;
      do {
        iVar2 = 0;
        do {
          uVar82 = 0;
          do {
            puVar67 = &DAT_00158240;
            pxVar88 = (xmlDocPtr)0x0;
            do {
              iVar4 = (int)pxVar55;
              iVar3 = xmlMemBlocks();
              pxVar59 = gen_xmlDocPtr(uVar72,iVar4);
              pxVar53 = gen_xmlNodePtr(uVar79,iVar4);
              pxVar60 = gen_xmlDocPtr(uVar80,iVar4);
              pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar2,iVar4);
              uVar65 = 0xffffffff;
              if (uVar82 < 4) {
                uVar65 = (&DAT_00158240)[uVar82];
              }
              xmlDOMWrapCloneNode(0,pxVar59,pxVar53,0,pxVar60,pxVar55,uVar65,*puVar67);
              call_tests = call_tests + 1;
              iVar4 = extraout_EDX_16;
              if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar59);
                iVar4 = extraout_EDX_17;
              }
              des_xmlNodePtr(uVar79,pxVar53,iVar4);
              iVar4 = extraout_EDX_18;
              if (((pxVar60 != (xmlDocPtr)0x0) && (api_doc != pxVar60)) && (pxVar60->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar60);
                iVar4 = extraout_EDX_19;
              }
              des_xmlNodePtr(iVar2,(xmlNodePtr)pxVar55,iVar4);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              iVar5 = (int)pxVar88;
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDOMWrapCloneNode",(ulong)(uint)(iVar4 - iVar3)
                      );
                test_ret_4 = test_ret_4 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar72);
                printf(" %d",(ulong)uVar79);
                printf(" %d",0);
                printf(" %d",(ulong)uVar80);
                printf(" %d",iVar2);
                printf(" %d",(ulong)uVar82);
                printf(" %d");
                putchar(10);
                pxVar55 = pxVar88;
              }
              uVar74 = iVar5 + 1;
              pxVar88 = (xmlDocPtr)(ulong)uVar74;
              puVar67 = puVar67 + 1;
            } while (uVar74 != 4);
            uVar82 = uVar82 + 1;
          } while (uVar82 != 4);
          iVar2 = iVar2 + 1;
        } while (iVar2 != 3);
        uVar80 = uVar80 + 1;
      } while (uVar80 != 4);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar22 = iVar22 + test_ret_4;
  iVar2 = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    uVar79 = 0;
    do {
      iVar4 = (int)pxVar55;
      iVar3 = xmlMemBlocks();
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar4);
      xmlDOMWrapReconcileNamespaces(0,pxVar55,*puVar67);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,nr_03);
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDOMWrapReconcileNamespaces",
               (ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar72);
        pxVar55 = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar88 = (xmlDocPtr)0x0;
      puVar67 = &DAT_00158240;
      do {
        iVar4 = (int)pxVar55;
        iVar5 = xmlMemBlocks();
        pxVar59 = gen_xmlDocPtr(uVar72,iVar4);
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar79,iVar4);
        xmlDOMWrapRemoveNode(0,pxVar59,pxVar55,*puVar67);
        call_tests = call_tests + 1;
        iVar4 = extraout_EDX_20;
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
          iVar4 = extraout_EDX_21;
        }
        des_xmlNodePtr(uVar79,(xmlNodePtr)pxVar55,iVar4);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        iVar6 = (int)pxVar88;
        if (iVar5 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",(ulong)(uint)(iVar4 - iVar5));
          iVar3 = iVar3 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar88;
        }
        uVar80 = iVar6 + 1;
        pxVar88 = (xmlDocPtr)(ulong)uVar80;
        puVar67 = puVar67 + 1;
      } while (uVar80 != 4);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar88 = (xmlDocPtr)0x0;
      puVar67 = &DAT_00158240;
      do {
        iVar6 = (int)pxVar55;
        iVar5 = xmlMemBlocks();
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar6);
        pxVar59 = gen_xmlDocPtr(uVar79,iVar6);
        pxVar53 = (xmlNodePtr)xmlDocCopyNode(pxVar55,pxVar59,*puVar67);
        desret_xmlNodePtr(pxVar53);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,nr_04);
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        iVar7 = (int)pxVar88;
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocCopyNode",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar88;
        }
        uVar80 = iVar7 + 1;
        pxVar88 = (xmlDocPtr)(ulong)uVar80;
        puVar67 = puVar67 + 1;
      } while (uVar80 != 4);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret_3 = 0;
  uVar72 = 0;
  do {
    pxVar88 = (xmlDocPtr)0x0;
    do {
      iVar5 = (int)pxVar55;
      iVar6 = xmlMemBlocks();
      pxVar59 = gen_xmlDocPtr(uVar72,iVar5);
      iVar7 = (int)pxVar88;
      pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar5);
      pxVar53 = (xmlNodePtr)xmlDocCopyNodeList(pxVar59,pxVar55);
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      iVar5 = extraout_EDX_22;
      if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
        xmlFreeDoc(pxVar59);
        iVar5 = extraout_EDX_23;
      }
      des_xmlNodePtr(iVar7,(xmlNodePtr)pxVar55,iVar5);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar6 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocCopyNodeList",(ulong)(uint)(iVar5 - iVar6));
        test_ret_3 = test_ret_3 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar88;
      }
      pxVar88 = (xmlDocPtr)(ulong)(iVar7 + 1U);
    } while (iVar7 + 1U != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  _test_ret = (undefined8 *)0x0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    uVar72 = 0;
    do {
      iVar7 = (int)pxVar55;
      iVar6 = xmlMemBlocks();
      if (bVar70) {
        iVar7 = 0x14caad;
        pFVar62 = fopen64("test.out","a+");
      }
      else {
        pFVar62 = (FILE *)0x0;
      }
      pxVar88 = gen_xmlDocPtr(uVar72,iVar7);
      pxVar55 = pxVar88;
      xmlDocDump(pFVar62);
      call_tests = call_tests + 1;
      if (pFVar62 != (FILE *)0x0) {
        fclose(pFVar62);
      }
      if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
        xmlFreeDoc(pxVar88);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDump",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",_test_ret);
        pxVar55 = (xmlDocPtr)(ulong)uVar72;
        printf(" %d");
        putchar(10);
      }
      uVar72 = uVar72 + 1;
    } while (uVar72 != 4);
    _test_ret = (undefined8 *)0x1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar72 = 0;
  do {
    _test_ret = (undefined8 *)0x0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar58 = 0;
      if (bVar70) {
        uVar58 = 0x15d438;
      }
      puVar67 = &DAT_00158240;
      uVar79 = 0;
      do {
        iVar8 = (int)pxVar55;
        iVar7 = xmlMemBlocks();
        pxVar88 = gen_xmlDocPtr(uVar72,iVar8);
        pxVar55 = (xmlDocPtr)0x0;
        xmlDocDumpFormatMemory(pxVar88,0,uVar58,*puVar67);
        call_tests = call_tests + 1;
        if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
          xmlFreeDoc(pxVar88);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpFormatMemory",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",0);
          printf(" %d",_test_ret);
          pxVar55 = (xmlDocPtr)(ulong)uVar79;
          printf(" %d");
          putchar(10);
        }
        uVar79 = uVar79 + 1;
        puVar67 = puVar67 + 1;
      } while (uVar79 != 4);
      _test_ret = (undefined8 *)0x1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar72 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      uVar58 = 0;
      if (bVar70) {
        uVar58 = 0x15d438;
      }
      do {
        puVar67 = &DAT_00158240;
        pxVar88 = (xmlDocPtr)0x0;
        do {
          iVar9 = (int)pxVar55;
          iVar8 = xmlMemBlocks();
          pxVar59 = gen_xmlDocPtr(uVar72,iVar9);
          if ((uint)uVar76 < 3) {
            uVar77 = (&DAT_0015ad48)[uVar76];
          }
          else {
            uVar77 = 0;
          }
          pxVar55 = (xmlDocPtr)0x0;
          xmlDocDumpFormatMemoryEnc(pxVar59,0,uVar58,uVar77,*puVar67);
          call_tests = call_tests + 1;
          if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
            xmlFreeDoc(pxVar59);
          }
          xmlResetLastError();
          iVar9 = xmlMemBlocks();
          iVar10 = (int)pxVar88;
          if (iVar8 != iVar9) {
            iVar9 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
                   (ulong)(uint)(iVar9 - iVar8));
            iVar7 = iVar7 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",0);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pxVar55 = pxVar88;
          }
          uVar79 = iVar10 + 1;
          pxVar88 = (xmlDocPtr)(ulong)uVar79;
          puVar67 = puVar67 + 1;
        } while (uVar79 != 4);
        uVar79 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar79;
      } while (uVar79 != 4);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  uVar72 = 0;
  do {
    pxVar88 = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      iVar9 = (int)pxVar55;
      iVar8 = xmlMemBlocks();
      pxVar59 = gen_xmlDocPtr(uVar72,iVar9);
      uVar58 = 0;
      if (bVar70) {
        uVar58 = 0x15d438;
      }
      pxVar55 = (xmlDocPtr)0x0;
      xmlDocDumpMemory(pxVar59,0,uVar58);
      call_tests = call_tests + 1;
      if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
        xmlFreeDoc(pxVar59);
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDumpMemory",(ulong)(uint)(iVar9 - iVar8));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar88;
      }
      pxVar88 = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar76 = 0;
  do {
    _test_ret = (undefined8 *)0x0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      pxVar88 = (xmlDocPtr)0x0;
      uVar58 = 0;
      if (bVar70) {
        uVar58 = 0x15d438;
      }
      puVar86 = &DAT_0015ad48;
      do {
        iVar10 = (int)pxVar55;
        iVar9 = xmlMemBlocks();
        pxVar59 = gen_xmlDocPtr((int)uVar76,iVar10);
        uVar72 = (uint)pxVar88;
        if (uVar72 < 3) {
          uVar77 = *puVar86;
        }
        else {
          uVar77 = 0;
        }
        pxVar55 = (xmlDocPtr)0x0;
        xmlDocDumpMemoryEnc(pxVar59,0,uVar58,uVar77);
        call_tests = call_tests + 1;
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
        }
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpMemoryEnc",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",uVar76);
          printf(" %d",0);
          printf(" %d",_test_ret);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar88;
        }
        uVar72 = uVar72 + 1;
        pxVar88 = (xmlDocPtr)(ulong)uVar72;
        puVar86 = puVar86 + 1;
      } while (uVar72 != 4);
      _test_ret = (undefined8 *)0x1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = (int)uVar76 + 1;
    uVar76 = (ulong)uVar72;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar9 = 0;
  _test_ret_2 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    uVar72 = 0;
    do {
      pxVar88 = (xmlDocPtr)0x0;
      puVar67 = &DAT_00158240;
      do {
        iVar11 = (int)pxVar55;
        iVar10 = xmlMemBlocks();
        if (bVar70) {
          iVar11 = 0x14caad;
          pFVar62 = fopen64("test.out","a+");
        }
        else {
          pFVar62 = (FILE *)0x0;
        }
        pxVar59 = gen_xmlDocPtr(uVar72,iVar11);
        pxVar55 = pxVar59;
        xmlDocFormatDump(pFVar62,pxVar59,*puVar67);
        call_tests = call_tests + 1;
        if (pFVar62 != (FILE *)0x0) {
          fclose(pFVar62);
        }
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
        }
        xmlResetLastError();
        iVar11 = xmlMemBlocks();
        iVar23 = (int)pxVar88;
        if (iVar10 != iVar11) {
          iVar11 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocFormatDump",(ulong)(uint)(iVar11 - iVar10));
          iVar9 = iVar9 + 1;
          printf(" %d",_test_ret_2);
          printf(" %d",(ulong)uVar72);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar88;
        }
        uVar79 = iVar23 + 1;
        pxVar88 = (xmlDocPtr)(ulong)uVar79;
        puVar67 = puVar67 + 1;
      } while (uVar79 != 4);
      uVar72 = uVar72 + 1;
    } while (uVar72 != 4);
    _test_ret_2 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  pxVar53 = (xmlNodePtr)xmlDocGetRootElement(0);
  desret_xmlNodePtr(pxVar53);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDocGetRootElement");
    pxVar55 = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar23 = 0;
  do {
    pxVar88 = (xmlDocPtr)0x0;
    do {
      iVar12 = (int)pxVar55;
      iVar73 = xmlMemBlocks();
      pxVar59 = gen_xmlDocPtr(uVar72,iVar12);
      iVar12 = (int)pxVar88;
      if (iVar12 == 0) {
        pxVar60 = (xmlDocPtr)xmlNewPI("test",0);
      }
      else {
        pxVar60 = (xmlDocPtr)0x0;
      }
      pxVar55 = pxVar60;
      pxVar53 = (xmlNodePtr)xmlDocSetRootElement(pxVar59);
      if (pxVar59 == (xmlDocPtr)0x0) {
        xmlFreeNode(pxVar60);
        desret_xmlNodePtr(pxVar53);
        call_tests = call_tests + 1;
      }
      else {
        desret_xmlNodePtr(pxVar53);
        call_tests = call_tests + 1;
        if ((api_doc != pxVar59) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
        }
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar73 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocSetRootElement",(ulong)(uint)(iVar14 - iVar73));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar55 = pxVar88;
      }
      uVar79 = iVar12 + 1;
      pxVar88 = (xmlDocPtr)(ulong)uVar79;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar73 = 0;
  _test_ret_2 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    uVar72 = 0;
    do {
      pxVar88 = (xmlDocPtr)0x0;
      do {
        iVar14 = (int)pxVar55;
        iVar12 = xmlMemBlocks();
        if (bVar70) {
          iVar14 = 0x14caad;
          pFVar62 = fopen64("test.out","a+");
        }
        else {
          pFVar62 = (FILE *)0x0;
        }
        pxVar59 = gen_xmlDocPtr(uVar72,iVar14);
        iVar13 = (int)pxVar88;
        pxVar55 = (xmlDocPtr)gen_xmlNodePtr(iVar13,iVar14);
        xmlElemDump(pFVar62,pxVar59,pxVar55);
        call_tests = call_tests + 1;
        iVar14 = extraout_EDX_24;
        if (pFVar62 != (FILE *)0x0) {
          fclose(pFVar62);
          iVar14 = extraout_EDX_25;
        }
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
          iVar14 = extraout_EDX_26;
        }
        des_xmlNodePtr(iVar13,(xmlNodePtr)pxVar55,iVar14);
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar12 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlElemDump",(ulong)(uint)(iVar14 - iVar12));
          iVar73 = iVar73 + 1;
          printf(" %d",_test_ret_2);
          printf(" %d",(ulong)uVar72);
          printf(" %d");
          putchar(10);
          pxVar55 = pxVar88;
        }
        pxVar88 = (xmlDocPtr)(ulong)(iVar13 + 1U);
      } while (iVar13 + 1U != 3);
      uVar72 = uVar72 + 1;
    } while (uVar72 != 4);
    _test_ret_2 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar12 = 0;
  do {
    iVar13 = (int)pxVar55;
    iVar14 = xmlMemBlocks();
    pxVar55 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar13);
    pxVar53 = (xmlNodePtr)xmlFirstElementChild(pxVar55);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar55,nr_05);
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar14 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFirstElementChild",(ulong)(uint)(iVar13 - iVar14));
      iVar12 = iVar12 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlGetBufferAllocationScheme();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar14 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetBufferAllocationScheme");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  xmlGetCompressMode();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetCompressMode");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = xmlMemBlocks();
  xmlGetDocCompressMode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar18 = xmlMemBlocks();
  if (iVar17 != iVar18) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetDocCompressMode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  pxVar53 = (xmlNodePtr)xmlGetIntSubset(0);
  desret_xmlNodePtr(pxVar53);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetIntSubset");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar21 = xmlMemBlocks();
  pxVar53 = (xmlNodePtr)xmlGetLastChild(0);
  desret_xmlNodePtr(pxVar53);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar24 = xmlMemBlocks();
  if (iVar21 != iVar24) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLastChild");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar25 = xmlMemBlocks();
  xmlGetLineNo(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar26 = xmlMemBlocks();
  if (iVar25 != iVar26) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetLineNo");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar75 = 0;
  iVar83 = 0;
  do {
    iVar27 = xmlMemBlocks();
    lVar57 = xmlGetNoNsProp(0);
    if (lVar57 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetNoNsProp",(ulong)(uint)(iVar28 - iVar27));
      iVar83 = iVar83 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar75 = iVar75 + 1;
  } while (iVar75 != 5);
  function_tests = function_tests + 1;
  iVar75 = xmlMemBlocks();
  lVar57 = xmlGetNodePath(0);
  if (lVar57 != 0) {
    (*_xmlFree)(lVar57);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar27 = xmlMemBlocks();
  if (iVar75 != iVar27) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlGetNodePath");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar28 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    uVar79 = 0;
    do {
      iVar29 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      if (uVar79 < 4) {
        uVar77 = *puVar86;
      }
      else {
        uVar77 = 0;
      }
      lVar57 = xmlGetNsProp(0,uVar58,uVar77);
      if (lVar57 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar30 = xmlMemBlocks();
      if (iVar29 != iVar30) {
        iVar30 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetNsProp",(ulong)(uint)(iVar30 - iVar29));
        iVar28 = iVar28 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar30 = 0;
  iVar29 = 0;
  do {
    iVar31 = xmlMemBlocks();
    lVar57 = xmlGetProp(0);
    if (lVar57 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar32 = xmlMemBlocks();
    if (iVar31 != iVar32) {
      iVar32 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetProp",(ulong)(uint)(iVar32 - iVar31));
      iVar29 = iVar29 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar30 = iVar30 + 1;
  } while (iVar30 != 5);
  function_tests = function_tests + 1;
  iVar30 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    uVar79 = 0;
    do {
      iVar31 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      if (uVar79 < 4) {
        uVar77 = *puVar86;
      }
      else {
        uVar77 = 0;
      }
      lVar57 = xmlHasNsProp(0,uVar58,uVar77);
      if (lVar57 != 0) {
        xmlUnlinkNode(lVar57);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar32 = xmlMemBlocks();
      if (iVar31 != iVar32) {
        iVar32 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHasNsProp",(ulong)(uint)(iVar32 - iVar31));
        iVar30 = iVar30 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar31 = 0;
  iVar32 = 0;
  do {
    iVar33 = xmlMemBlocks();
    lVar57 = xmlHasProp(0);
    if (lVar57 != 0) {
      xmlUnlinkNode(lVar57);
      xmlFreeNode();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar34 = xmlMemBlocks();
    if (iVar33 != iVar34) {
      iVar34 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasProp",(ulong)(uint)(iVar34 - iVar33));
      iVar32 = iVar32 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar31 = iVar31 + 1;
  } while (iVar31 != 5);
  function_tests = function_tests + 1;
  iVar31 = xmlMemBlocks();
  xmlIsBlankNode(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar33 = xmlMemBlocks();
  if (iVar31 != iVar33) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlIsBlankNode");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar34 = 0;
  uVar72 = 0;
  do {
    pxVar53 = (xmlNodePtr)0x0;
    puVar86 = &DAT_0015ad60;
    do {
      iVar35 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      uVar79 = (uint)pxVar53;
      if (uVar79 < 4) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      xmlIsXHTML(uVar58);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar36 = xmlMemBlocks();
      if (iVar35 != iVar36) {
        iVar36 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsXHTML",(ulong)(uint)(iVar36 - iVar35));
        iVar34 = iVar34 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = (char *)pxVar53;
      }
      uVar79 = uVar79 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar35 = 0;
  do {
    iVar37 = (int)pcVar63;
    iVar36 = xmlMemBlocks();
    pcVar63 = (char *)gen_xmlNodePtr(uVar72,iVar37);
    pxVar53 = (xmlNodePtr)xmlLastElementChild(pcVar63);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar72,(xmlNodePtr)pcVar63,nr_06);
    xmlResetLastError();
    iVar37 = xmlMemBlocks();
    if (iVar36 != iVar37) {
      iVar37 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLastElementChild",(ulong)(uint)(iVar37 - iVar36));
      iVar35 = iVar35 + 1;
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar36 = 0;
  uVar72 = 0;
  do {
    iVar37 = 0;
    do {
      pxVar53 = (xmlNodePtr)0x0;
      piVar87 = &DAT_00158240;
      do {
        iVar40 = (int)pcVar63;
        iVar38 = xmlMemBlocks();
        pxVar88 = gen_xmlDocPtr(uVar72,iVar40);
        switch(iVar37) {
        case 0:
          bVar1 = false;
          pcVar63 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar63 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar63 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar63 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar63 = (char *)0x0;
        }
        iVar40 = *piVar87;
        if ((!bVar1) && (iVar39 = xmlStrlen(pcVar63), iVar39 < iVar40)) {
          iVar40 = 0;
        }
        pxVar61 = (xmlNodePtr)xmlNewCDataBlock(pxVar88,pcVar63,iVar40);
        desret_xmlNodePtr(pxVar61);
        call_tests = call_tests + 1;
        if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
          xmlFreeDoc(pxVar88);
        }
        xmlResetLastError();
        iVar40 = xmlMemBlocks();
        iVar39 = (int)pxVar53;
        if (iVar38 != iVar40) {
          iVar40 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewCDataBlock",(ulong)(uint)(iVar40 - iVar38));
          iVar36 = iVar36 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",iVar37);
          printf(" %d");
          putchar(10);
          pcVar63 = (char *)pxVar53;
        }
        uVar79 = iVar39 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar79;
        piVar87 = piVar87 + 1;
      } while (uVar79 != 4);
      iVar37 = iVar37 + 1;
    } while (iVar37 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar37 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar53 = (xmlNodePtr)0x0;
    do {
      iVar40 = (int)pcVar63;
      iVar38 = xmlMemBlocks();
      pxVar88 = gen_xmlDocPtr(uVar72,iVar40);
      uVar79 = (uint)pxVar53;
      if (uVar79 < 4) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      pxVar61 = (xmlNodePtr)xmlNewCharRef(pxVar88);
      desret_xmlNodePtr(pxVar61);
      call_tests = call_tests + 1;
      if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
        xmlFreeDoc(pxVar88);
      }
      xmlResetLastError();
      iVar40 = xmlMemBlocks();
      if (iVar38 != iVar40) {
        iVar40 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewCharRef",(ulong)(uint)(iVar40 - iVar38));
        iVar37 = iVar37 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = (char *)pxVar53;
      }
      uVar79 = uVar79 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar38 = 0;
  uVar72 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar53 = (xmlNodePtr)0x0;
        do {
          iVar39 = (int)pcVar63;
          iVar40 = xmlMemBlocks();
          pcVar63 = (char *)gen_xmlNodePtr(uVar72,iVar39);
          if (bVar70) {
            get_api_root();
            pxVar68 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar68 = api_ns;
            }
          }
          else {
            pxVar68 = (xmlNs *)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pxVar53;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar61 = (xmlNodePtr)xmlNewChild(pcVar63,pxVar68,uVar58,uVar77);
          desret_xmlNodePtr(pxVar61);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar72,(xmlNodePtr)pcVar63,nr_07);
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar39 = xmlMemBlocks();
          if (iVar40 != iVar39) {
            iVar39 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewChild",(ulong)(uint)(iVar39 - iVar40));
            iVar38 = iVar38 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pcVar63 = (char *)pxVar53;
          }
          uVar79 = uVar79 + 1;
          pxVar53 = (xmlNodePtr)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        uVar79 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar79;
      } while (uVar79 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  puVar86 = &DAT_0015ad60;
  uVar72 = 0;
  iVar40 = 0;
  do {
    iVar39 = xmlMemBlocks();
    if (uVar72 < 4) {
      uVar58 = *puVar86;
    }
    else {
      uVar58 = 0;
    }
    pxVar53 = (xmlNodePtr)xmlNewComment(uVar58);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar41 = xmlMemBlocks();
    if (iVar39 != iVar41) {
      iVar41 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewComment",(ulong)(uint)(iVar41 - iVar39));
      iVar40 = iVar40 + 1;
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar86 = puVar86 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  puVar86 = &DAT_0015ad60;
  uVar72 = 0;
  iVar39 = 0;
  do {
    iVar41 = xmlMemBlocks();
    if (uVar72 < 4) {
      uVar58 = *puVar86;
    }
    else {
      uVar58 = 0;
    }
    pxVar88 = (xmlDocPtr)xmlNewDoc(uVar58);
    if (api_doc != pxVar88) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar42 = xmlMemBlocks();
    if (iVar41 != iVar42) {
      iVar42 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDoc",(ulong)(uint)(iVar42 - iVar41));
      iVar39 = iVar39 + 1;
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar86 = puVar86 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar41 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar53 = (xmlNodePtr)0x0;
    do {
      iVar43 = (int)pcVar63;
      iVar42 = xmlMemBlocks();
      pxVar88 = gen_xmlDocPtr(uVar72,iVar43);
      uVar79 = (uint)pxVar53;
      if (uVar79 < 4) {
        pcVar63 = (char *)*puVar86;
      }
      else {
        pcVar63 = (char *)0x0;
      }
      pxVar61 = (xmlNodePtr)xmlNewDocComment(pxVar88);
      desret_xmlNodePtr(pxVar61);
      call_tests = call_tests + 1;
      if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
        xmlFreeDoc(pxVar88);
      }
      xmlResetLastError();
      iVar43 = xmlMemBlocks();
      if (iVar42 != iVar43) {
        iVar43 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewDocComment",(ulong)(uint)(iVar43 - iVar42));
        iVar41 = iVar41 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = (char *)pxVar53;
      }
      uVar79 = uVar79 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_4 = 0;
  do {
    iVar42 = xmlMemBlocks();
    pxVar88 = gen_xmlDocPtr(uVar72,(int)pcVar63);
    pxVar53 = (xmlNodePtr)xmlNewDocFragment(pxVar88);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
      xmlFreeDoc(pxVar88);
    }
    xmlResetLastError();
    iVar43 = xmlMemBlocks();
    if (iVar42 != iVar43) {
      iVar43 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocFragment",(ulong)(uint)(iVar43 - iVar42));
      test_ret_4 = test_ret_4 + 1;
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar42 = 0;
  uVar72 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar53 = (xmlNodePtr)0x0;
        do {
          iVar44 = (int)pcVar63;
          iVar43 = xmlMemBlocks();
          pxVar88 = gen_xmlDocPtr(uVar72,iVar44);
          if (bVar70) {
            get_api_root();
            pcVar63 = (char *)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pcVar63 = (char *)api_ns;
            }
          }
          else {
            pcVar63 = (char *)(xmlNodePtr)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pxVar53;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar61 = (xmlNodePtr)xmlNewDocNode(pxVar88,pcVar63,uVar58,uVar77);
          desret_xmlNodePtr(pxVar61);
          call_tests = call_tests + 1;
          if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
            xmlFreeDoc(pxVar88);
          }
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar44 = xmlMemBlocks();
          if (iVar43 != iVar44) {
            iVar44 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNode",(ulong)(uint)(iVar44 - iVar43));
            iVar42 = iVar42 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pcVar63 = (char *)pxVar53;
          }
          uVar79 = uVar79 + 1;
          pxVar53 = (xmlNodePtr)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        uVar79 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar79;
      } while (uVar79 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar43 = 0;
  uVar72 = 0;
  do {
    _test_ret_5 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      _test_ret_27 = 0;
      bVar1 = true;
      do {
        bVar71 = bVar1;
        puVar86 = &DAT_0015ad60;
        pxVar53 = (xmlNodePtr)0x0;
        do {
          iVar45 = (int)pcVar63;
          iVar44 = xmlMemBlocks();
          pxVar88 = gen_xmlDocPtr(uVar72,iVar45);
          if (bVar70) {
            get_api_root();
            pcVar63 = (char *)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pcVar63 = (char *)api_ns;
            }
          }
          else {
            pcVar63 = (char *)(xmlNodePtr)0x0;
          }
          if (bVar71) {
            uVar58 = xmlStrdup("eaten");
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pxVar53;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar61 = (xmlNodePtr)xmlNewDocNodeEatName(pxVar88,pcVar63,uVar58,uVar77);
          desret_xmlNodePtr(pxVar61);
          call_tests = call_tests + 1;
          if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
            xmlFreeDoc(pxVar88);
          }
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar45 = xmlMemBlocks();
          if (iVar44 != iVar45) {
            iVar45 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNodeEatName",(ulong)(uint)(iVar45 - iVar44))
            ;
            iVar43 = iVar43 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",_test_ret_5);
            printf(" %d",_test_ret_27);
            printf(" %d");
            putchar(10);
            pcVar63 = (char *)pxVar53;
          }
          uVar79 = uVar79 + 1;
          pxVar53 = (xmlNodePtr)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        _test_ret_27 = 1;
        bVar1 = false;
      } while (bVar71);
      _test_ret_5 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar44 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar53 = (xmlNodePtr)0x0;
      puVar86 = &DAT_0015ad60;
      do {
        iVar46 = (int)pcVar63;
        iVar45 = xmlMemBlocks();
        pxVar88 = gen_xmlDocPtr(uVar72,iVar46);
        if (uVar79 < 4) {
          pcVar63 = (char *)(&DAT_0015ad60)[uVar79];
        }
        else {
          pcVar63 = (char *)0x0;
        }
        uVar80 = (uint)pxVar53;
        if (uVar80 < 4) {
          uVar58 = *puVar86;
        }
        else {
          uVar58 = 0;
        }
        pxVar61 = (xmlNodePtr)xmlNewDocPI(pxVar88,pcVar63,uVar58);
        desret_xmlNodePtr(pxVar61);
        call_tests = call_tests + 1;
        if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
          xmlFreeDoc(pxVar88);
        }
        xmlResetLastError();
        iVar46 = xmlMemBlocks();
        if (iVar45 != iVar46) {
          iVar46 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocPI",(ulong)(uint)(iVar46 - iVar45));
          iVar44 = iVar44 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pcVar63 = (char *)pxVar53;
        }
        uVar80 = uVar80 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar45 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar53 = (xmlNodePtr)0x0;
      puVar86 = &DAT_0015ad60;
      do {
        iVar47 = (int)pcVar63;
        iVar46 = xmlMemBlocks();
        pxVar88 = gen_xmlDocPtr(uVar72,iVar47);
        if (uVar79 < 4) {
          pcVar63 = (char *)(&DAT_0015ad60)[uVar79];
        }
        else {
          pcVar63 = (char *)0x0;
        }
        uVar80 = (uint)pxVar53;
        if (uVar80 < 4) {
          uVar58 = *puVar86;
        }
        else {
          uVar58 = 0;
        }
        lVar57 = xmlNewDocProp(pxVar88,pcVar63,uVar58);
        if (lVar57 != 0) {
          xmlUnlinkNode(lVar57);
          xmlFreeNode(lVar57);
        }
        call_tests = call_tests + 1;
        if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
          xmlFreeDoc(pxVar88);
        }
        xmlResetLastError();
        iVar47 = xmlMemBlocks();
        if (iVar46 != iVar47) {
          iVar47 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocProp",(ulong)(uint)(iVar47 - iVar46));
          iVar45 = iVar45 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pcVar63 = (char *)pxVar53;
        }
        uVar80 = uVar80 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar46 = 0;
  uVar72 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar53 = (xmlNodePtr)0x0;
        do {
          iVar48 = (int)pcVar63;
          iVar47 = xmlMemBlocks();
          pxVar88 = gen_xmlDocPtr(uVar72,iVar48);
          if (bVar70) {
            get_api_root();
            pcVar63 = (char *)api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pcVar63 = (char *)api_ns;
            }
          }
          else {
            pcVar63 = (char *)(xmlNodePtr)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pxVar53;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar61 = (xmlNodePtr)xmlNewDocRawNode(pxVar88,pcVar63,uVar58,uVar77);
          desret_xmlNodePtr(pxVar61);
          call_tests = call_tests + 1;
          if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
            xmlFreeDoc(pxVar88);
          }
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar48 = xmlMemBlocks();
          if (iVar47 != iVar48) {
            iVar48 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocRawNode",(ulong)(uint)(iVar48 - iVar47));
            iVar46 = iVar46 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pcVar63 = (char *)pxVar53;
          }
          uVar79 = uVar79 + 1;
          pxVar53 = (xmlNodePtr)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        uVar79 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar79;
      } while (uVar79 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  puVar86 = &DAT_0015ad60;
  uVar72 = 0;
  iVar47 = 0;
  do {
    iVar48 = xmlMemBlocks();
    if (uVar72 < 4) {
      pcVar63 = (char *)*puVar86;
    }
    else {
      pcVar63 = (char *)0x0;
    }
    pxVar53 = (xmlNodePtr)xmlNewDocText(0);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar49 = xmlMemBlocks();
    if (iVar48 != iVar49) {
      iVar49 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocText",(ulong)(uint)(iVar49 - iVar48));
      iVar47 = iVar47 + 1;
      printf(" %d",0);
      pcVar63 = (char *)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar86 = puVar86 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar48 = 0;
  uVar72 = 0;
  do {
    iVar49 = 0;
    do {
      pcVar85 = (char *)0x0;
      piVar87 = &DAT_00158240;
      do {
        iVar52 = (int)pcVar63;
        iVar50 = xmlMemBlocks();
        pxVar88 = gen_xmlDocPtr(uVar72,iVar52);
        switch(iVar49) {
        case 0:
          bVar1 = false;
          pcVar63 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar63 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar63 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar63 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar63 = (char *)0x0;
        }
        iVar52 = *piVar87;
        if ((!bVar1) && (iVar51 = xmlStrlen(pcVar63), iVar51 < iVar52)) {
          iVar52 = 0;
        }
        pxVar53 = (xmlNodePtr)xmlNewDocTextLen(pxVar88,pcVar63,iVar52);
        desret_xmlNodePtr(pxVar53);
        call_tests = call_tests + 1;
        if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
          xmlFreeDoc(pxVar88);
        }
        xmlResetLastError();
        iVar52 = xmlMemBlocks();
        iVar51 = (int)pcVar85;
        if (iVar50 != iVar52) {
          iVar52 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocTextLen",(ulong)(uint)(iVar52 - iVar50));
          iVar48 = iVar48 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",iVar49);
          printf(" %d");
          putchar(10);
          pcVar63 = pcVar85;
        }
        uVar79 = iVar51 + 1;
        pcVar85 = (char *)(ulong)uVar79;
        piVar87 = piVar87 + 1;
      } while (uVar79 != 4);
      iVar49 = iVar49 + 1;
    } while (iVar49 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar72 = 0;
  do {
    uVar76 = 0;
    do {
      uVar81 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pcVar85 = (char *)0x0;
        do {
          iVar50 = (int)pcVar63;
          iVar49 = xmlMemBlocks();
          pxVar88 = gen_xmlDocPtr(uVar72,iVar50);
          if ((uint)uVar76 < 4) {
            pcVar63 = (char *)(&DAT_0015ad60)[uVar76];
          }
          else {
            pcVar63 = (char *)0x0;
          }
          if ((uint)uVar81 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar81];
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pcVar85;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar53 = (xmlNodePtr)xmlNewDtd(pxVar88,pcVar63,uVar58,uVar77);
          desret_xmlNodePtr(pxVar53);
          call_tests = call_tests + 1;
          if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)) {
            xmlFreeDoc(pxVar88);
          }
          xmlResetLastError();
          iVar50 = xmlMemBlocks();
          if (iVar49 != iVar50) {
            iVar50 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDtd",(ulong)(uint)(iVar50 - iVar49));
            test_ret_2 = test_ret_2 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",uVar76);
            printf(" %d",uVar81);
            printf(" %d");
            putchar(10);
            pcVar63 = pcVar85;
          }
          uVar79 = uVar79 + 1;
          pcVar85 = (char *)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        uVar79 = (uint)uVar81 + 1;
        uVar81 = (ulong)uVar79;
      } while (uVar79 != 5);
      uVar79 = (uint)uVar76 + 1;
      uVar76 = (ulong)uVar79;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar49 = 0;
  uVar72 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    iVar50 = 0;
    do {
      iVar52 = xmlMemBlocks();
      if (bVar70) {
        get_api_root();
        pxVar68 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
          pxVar68 = api_ns;
        }
      }
      else {
        pxVar68 = (xmlNs *)0x0;
      }
      pxVar53 = (xmlNodePtr)xmlNewNode(pxVar68);
      desret_xmlNodePtr(pxVar53);
      call_tests = call_tests + 1;
      if (bVar70) {
        xmlFreeDoc();
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar51 = xmlMemBlocks();
      if (iVar52 != iVar51) {
        iVar51 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNode",(ulong)(uint)(iVar51 - iVar52));
        iVar49 = iVar49 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
      }
      iVar50 = iVar50 + 1;
    } while (iVar50 != 5);
    uVar72 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar50 = 0;
  _test_ret = (undefined8 *)0x0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    pxVar53 = (xmlNodePtr)0x0;
    bVar1 = true;
    do {
      bVar71 = bVar1;
      iVar52 = xmlMemBlocks();
      if (bVar70) {
        get_api_root();
        pxVar68 = api_ns;
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
          pxVar68 = api_ns;
        }
      }
      else {
        pxVar68 = (xmlNs *)0x0;
      }
      if (bVar71) {
        pxVar61 = (xmlNodePtr)xmlStrdup("eaten");
      }
      else {
        pxVar61 = (xmlNodePtr)0x0;
      }
      pxVar64 = (xmlNodePtr)xmlNewNodeEatName(pxVar68);
      desret_xmlNodePtr(pxVar64);
      call_tests = call_tests + 1;
      if (bVar70) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar51 = xmlMemBlocks();
      if (iVar52 != iVar51) {
        iVar51 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNodeEatName",(ulong)(uint)(iVar51 - iVar52));
        iVar50 = iVar50 + 1;
        printf(" %d",_test_ret);
        printf(" %d");
        putchar(10);
        pxVar61 = pxVar53;
      }
      pxVar53 = (xmlNodePtr)0x1;
      bVar1 = false;
    } while (bVar71);
    _test_ret = (undefined8 *)0x1;
    bVar1 = false;
  } while (bVar70);
  iVar22 = iVar46 + iVar47 +
           iVar34 + iVar35 +
           test_ret_1 + iVar8 + test_ret_3 + iVar5 + iVar22 + iVar2 + iVar3 + iVar4 + iVar6 + iVar7
           + iVar9 + (uint)(iVar10 != iVar11) + iVar23 + iVar73 + iVar12 + (uint)(iVar14 != iVar13)
           + (uint)(iVar15 != iVar16) + (uint)(iVar17 != iVar18) + (uint)(iVar19 != iVar20) +
           (uint)(iVar21 != iVar24) + (uint)(iVar25 != iVar26) + iVar83 + (uint)(iVar75 != iVar27) +
           iVar28 + iVar29 + iVar30 + iVar32 + (uint)(iVar31 != iVar33) + iVar36 + iVar37 + iVar38 +
           iVar40 + iVar39 + iVar41 + test_ret_4 + iVar42 + iVar43 + iVar44 + iVar45 + iVar48 +
           test_ret_2;
  function_tests = function_tests + 1;
  test_ret_28 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      puVar86 = &DAT_0015ad60;
      pxVar53 = (xmlNodePtr)0x0;
      do {
        iVar3 = (int)pxVar61;
        iVar2 = xmlMemBlocks();
        pxVar61 = gen_xmlNodePtr(uVar72,iVar3);
        if (uVar79 < 4) {
          uVar58 = (&DAT_0015ad60)[uVar79];
        }
        else {
          uVar58 = 0;
        }
        uVar80 = (uint)pxVar53;
        if (uVar80 < 4) {
          uVar77 = *puVar86;
        }
        else {
          uVar77 = 0;
        }
        auVar89 = xmlNewNs(pxVar61,uVar58,uVar77);
        iVar3 = auVar89._8_4_;
        if ((pxVar61 == (xmlNodePtr)0x0) && (auVar89._0_8_ != 0)) {
          xmlFreeNs(auVar89._0_8_);
          iVar3 = extraout_EDX_27;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,pxVar61,iVar3);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewNs",(ulong)(uint)(iVar3 - iVar2));
          test_ret_28 = test_ret_28 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar61 = pxVar53;
        }
        uVar80 = uVar80 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    _test_ret_27 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar53 = (xmlNodePtr)0x0;
        do {
          iVar5 = (int)pxVar61;
          iVar4 = xmlMemBlocks();
          pxVar61 = gen_xmlNodePtr(iVar3,iVar5);
          if (bVar70) {
            get_api_root();
            pxVar68 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar68 = api_ns;
            }
          }
          else {
            pxVar68 = (xmlNs *)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar72 = (uint)pxVar53;
          if (uVar72 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          auVar89 = xmlNewNsProp(pxVar61,pxVar68,uVar58,uVar77);
          iVar5 = auVar89._8_4_;
          lVar57 = auVar89._0_8_;
          if (lVar57 != 0) {
            xmlUnlinkNode(lVar57);
            xmlFreeNode(lVar57);
            iVar5 = extraout_EDX_28;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar3,pxVar61,iVar5);
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsProp",(ulong)(uint)(iVar5 - iVar4));
            iVar2 = iVar2 + 1;
            printf(" %d",iVar3);
            printf(" %d",_test_ret_27);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pxVar61 = pxVar53;
          }
          uVar72 = uVar72 + 1;
          pxVar53 = (xmlNodePtr)(ulong)uVar72;
          puVar86 = puVar86 + 1;
        } while (uVar72 != 5);
        uVar72 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar72;
      } while (uVar72 != 5);
      _test_ret_27 = 1;
      bVar1 = false;
    } while (bVar70);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar72 = 0;
  do {
    _test_ret_5 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      _test_ret_27 = 0;
      bVar1 = true;
      do {
        bVar71 = bVar1;
        puVar86 = &DAT_0015ad60;
        pxVar53 = (xmlNodePtr)0x0;
        do {
          iVar4 = (int)pxVar61;
          iVar3 = xmlMemBlocks();
          pxVar61 = gen_xmlNodePtr(uVar72,iVar4);
          if (bVar70) {
            get_api_root();
            pxVar68 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar68 = api_ns;
            }
          }
          else {
            pxVar68 = (xmlNs *)0x0;
          }
          if (bVar71) {
            uVar58 = xmlStrdup("eaten");
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pxVar53;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          auVar89 = xmlNewNsPropEatName(pxVar61,pxVar68,uVar58,uVar77);
          iVar4 = auVar89._8_4_;
          lVar57 = auVar89._0_8_;
          if (lVar57 != 0) {
            xmlUnlinkNode(lVar57);
            xmlFreeNode(lVar57);
            iVar4 = extraout_EDX_29;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar72,pxVar61,iVar4);
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsPropEatName",(ulong)(uint)(iVar4 - iVar3));
            test_ret_4 = test_ret_4 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",_test_ret_5);
            printf(" %d",_test_ret_27);
            printf(" %d");
            putchar(10);
            pxVar61 = pxVar53;
          }
          uVar79 = uVar79 + 1;
          pxVar53 = (xmlNodePtr)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        _test_ret_27 = 1;
        bVar1 = false;
      } while (bVar71);
      _test_ret_5 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    uVar79 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      if (uVar79 < 4) {
        pxVar53 = (xmlNodePtr)*puVar86;
      }
      else {
        pxVar53 = (xmlNodePtr)0x0;
      }
      pxVar61 = (xmlNodePtr)xmlNewPI(uVar58);
      desret_xmlNodePtr(pxVar61);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewPI",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar72);
        pxVar53 = (xmlNodePtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar61 = (xmlNodePtr)0x0;
      puVar86 = &DAT_0015ad60;
      do {
        iVar6 = (int)pxVar53;
        iVar5 = xmlMemBlocks();
        pxVar53 = gen_xmlNodePtr(uVar72,iVar6);
        if (uVar79 < 4) {
          uVar58 = (&DAT_0015ad60)[uVar79];
        }
        else {
          uVar58 = 0;
        }
        uVar80 = (uint)pxVar61;
        if (uVar80 < 4) {
          uVar77 = *puVar86;
        }
        else {
          uVar77 = 0;
        }
        auVar89 = xmlNewProp(pxVar53,uVar58,uVar77);
        iVar6 = auVar89._8_4_;
        lVar57 = auVar89._0_8_;
        if (lVar57 != 0) {
          xmlUnlinkNode(lVar57);
          xmlFreeNode(lVar57);
          iVar6 = extraout_EDX_30;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,pxVar53,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewProp",(ulong)(uint)(iVar6 - iVar5));
          iVar4 = iVar4 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar53 = pxVar61;
        }
        uVar80 = uVar80 + 1;
        pxVar61 = (xmlNodePtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  puVar86 = &DAT_0015ad60;
  uVar72 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar72 < 4) {
      pxVar53 = (xmlNodePtr)*puVar86;
    }
    else {
      pxVar53 = (xmlNodePtr)0x0;
    }
    pxVar61 = (xmlNodePtr)xmlNewReference(0);
    desret_xmlNodePtr(pxVar61);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewReference",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",0);
      pxVar53 = (xmlNodePtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar86 = puVar86 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  puVar86 = &DAT_0015ad60;
  uVar72 = 0;
  test_ret_5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar72 < 4) {
      uVar58 = *puVar86;
    }
    else {
      uVar58 = 0;
    }
    pxVar61 = (xmlNodePtr)xmlNewText(uVar58);
    desret_xmlNodePtr(pxVar61);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewText",(ulong)(uint)(iVar7 - iVar6));
      test_ret_5 = test_ret_5 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar86 = puVar86 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar72 = 0;
  do {
    _test_ret_2 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar61 = (xmlNodePtr)0x0;
        do {
          iVar8 = (int)pxVar53;
          iVar7 = xmlMemBlocks();
          pxVar53 = gen_xmlNodePtr(uVar72,iVar8);
          if (bVar70) {
            get_api_root();
            pxVar68 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar68 = api_ns;
            }
          }
          else {
            pxVar68 = (xmlNs *)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar79 = (uint)pxVar61;
          if (uVar79 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          pxVar64 = (xmlNodePtr)xmlNewTextChild(pxVar53,pxVar68,uVar58,uVar77);
          desret_xmlNodePtr(pxVar64);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar72,pxVar53,nr_08);
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar7 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewTextChild",(ulong)(uint)(iVar8 - iVar7));
            iVar6 = iVar6 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",_test_ret_2);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pxVar53 = pxVar61;
          }
          uVar79 = uVar79 + 1;
          pxVar61 = (xmlNodePtr)(ulong)uVar79;
          puVar86 = puVar86 + 1;
        } while (uVar79 != 5);
        uVar79 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar79;
      } while (uVar79 != 5);
      _test_ret_2 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_2 = 0;
  do {
    puVar84 = &DAT_00158240;
    pxVar53 = (xmlNodePtr)0x0;
    do {
      iVar7 = xmlMemBlocks();
      switch(uVar72) {
      case 0:
        bVar1 = false;
        pcVar63 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar63 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar63 = anon_var_dwarf_19f;
        break;
      case 3:
        bVar1 = false;
        pcVar63 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar63 = (char *)0x0;
      }
      uVar79 = *puVar84;
      if ((!bVar1) && (iVar8 = xmlStrlen(pcVar63), iVar8 < (int)uVar79)) {
        uVar79 = 0;
      }
      pxVar61 = (xmlNodePtr)(ulong)uVar79;
      pxVar64 = (xmlNodePtr)xmlNewTextLen(pcVar63);
      desret_xmlNodePtr(pxVar64);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      iVar9 = (int)pxVar53;
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextLen",(ulong)(uint)(iVar8 - iVar7));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar61 = pxVar53;
      }
      uVar79 = iVar9 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      puVar84 = puVar84 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_17 = 0;
  do {
    iVar8 = (int)pxVar61;
    iVar7 = xmlMemBlocks();
    pxVar61 = gen_xmlNodePtr(uVar72,iVar8);
    pxVar53 = (xmlNodePtr)xmlNextElementSibling(pxVar61);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar72,pxVar61,nr_09);
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextElementSibling",(ulong)(uint)(iVar8 - iVar7));
      test_ret_17 = test_ret_17 + 1;
      pxVar61 = (xmlNodePtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar53 = (xmlNodePtr)0x0;
    do {
      iVar9 = (int)pxVar61;
      iVar8 = xmlMemBlocks();
      pxVar61 = gen_xmlNodePtr(uVar72,iVar9);
      uVar79 = (uint)pxVar53;
      if (uVar79 < 4) {
        uVar58 = *puVar86;
      }
      else {
        uVar58 = 0;
      }
      xmlNodeAddContent(pxVar61,uVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,pxVar61,nr_10);
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeAddContent",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar61 = pxVar53;
      }
      uVar79 = uVar79 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  iVar2 = test_ret_5 + iVar6 +
          iVar22 + iVar49 + iVar50 + test_ret_28 + iVar2 + test_ret_4 + iVar3 + iVar4 + iVar5 +
          test_ret_2;
  function_tests = function_tests + 1;
  iVar22 = 0;
  iVar3 = 0;
  do {
    uVar76 = 0;
    do {
      pxVar53 = (xmlNodePtr)0x0;
      piVar87 = &DAT_00158240;
      do {
        iVar5 = (int)pxVar61;
        iVar4 = xmlMemBlocks();
        pxVar61 = gen_xmlNodePtr(iVar3,iVar5);
        switch(uVar76) {
        case 0:
          bVar1 = false;
          pcVar63 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar63 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar63 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar63 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar63 = (char *)0x0;
        }
        iVar5 = *piVar87;
        if ((!bVar1) && (iVar6 = xmlStrlen(pcVar63), iVar6 < iVar5)) {
          iVar5 = 0;
        }
        xmlNodeAddContentLen(pxVar61,pcVar63,iVar5);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar3,pxVar61,nr_11);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        iVar6 = (int)pxVar53;
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeAddContentLen",(ulong)(uint)(iVar5 - iVar4));
          iVar22 = iVar22 + 1;
          printf(" %d",iVar3);
          printf(" %d",uVar76);
          printf(" %d");
          putchar(10);
          pxVar61 = pxVar53;
        }
        uVar72 = iVar6 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar72;
        piVar87 = piVar87 + 1;
      } while (uVar72 != 4);
      uVar72 = (int)uVar76 + 1;
      uVar76 = (ulong)uVar72;
    } while (uVar72 != 5);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar3 = 0;
  do {
    iVar6 = (int)pxVar61;
    iVar5 = xmlMemBlocks();
    pxVar54 = gen_xmlBufferPtr(iVar3,iVar6);
    pxVar61 = (xmlNodePtr)0x0;
    xmlNodeBufGetContent(pxVar54);
    call_tests = call_tests + 1;
    if (pxVar54 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar54);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeBufGetContent",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      printf(" %d");
      pxVar61 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  test_ret_28 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      uVar80 = 0;
      do {
        uVar82 = 0;
        do {
          pxVar53 = (xmlNodePtr)0x0;
          puVar67 = &DAT_00158240;
          do {
            iVar5 = (int)pxVar61;
            iVar3 = xmlMemBlocks();
            pxVar54 = gen_xmlBufferPtr(uVar72,iVar5);
            pxVar88 = gen_xmlDocPtr(uVar79,iVar5);
            pxVar61 = gen_xmlNodePtr(uVar80,iVar5);
            uVar65 = 0xffffffff;
            if (uVar82 < 4) {
              uVar65 = (&DAT_00158240)[uVar82];
            }
            xmlNodeDump(pxVar54,pxVar88,pxVar61,uVar65,*puVar67);
            call_tests = call_tests + 1;
            iVar5 = extraout_EDX_31;
            if (pxVar54 != (xmlBufferPtr)0x0) {
              xmlBufferFree(pxVar54);
              iVar5 = extraout_EDX_32;
            }
            if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc))
            {
              xmlFreeDoc(pxVar88);
              iVar5 = extraout_EDX_33;
            }
            des_xmlNodePtr(uVar80,pxVar61,iVar5);
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            iVar6 = (int)pxVar53;
            if (iVar3 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNodeDump",(ulong)(uint)(iVar5 - iVar3));
              test_ret_28 = test_ret_28 + 1;
              printf(" %d",(ulong)uVar72);
              printf(" %d",(ulong)uVar79);
              printf(" %d",(ulong)uVar80);
              printf(" %d",(ulong)uVar82);
              printf(" %d");
              putchar(10);
              pxVar61 = pxVar53;
            }
            uVar74 = iVar6 + 1;
            pxVar53 = (xmlNodePtr)(ulong)uVar74;
            puVar67 = puVar67 + 1;
          } while (uVar74 != 4);
          uVar82 = uVar82 + 1;
        } while (uVar82 != 4);
        uVar80 = uVar80 + 1;
      } while (uVar80 != 3);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  test_ret_4 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    uVar72 = 0;
    do {
      uVar76 = 0;
      do {
        uVar79 = 0;
        do {
          uVar80 = 0;
          do {
            puVar86 = &DAT_0015ad48;
            uVar82 = 0;
            do {
              iVar6 = (int)pxVar61;
              iVar5 = xmlMemBlocks();
              if (bVar70) {
                iVar6 = 0;
                lVar57 = xmlOutputBufferCreateFilename("test.out",0,0);
              }
              else {
                lVar57 = 0;
              }
              pxVar88 = gen_xmlDocPtr(uVar72,iVar6);
              iVar8 = (int)uVar76;
              pxVar61 = gen_xmlNodePtr(iVar8,iVar6);
              uVar78 = 0xffffffff;
              uVar65 = 0xffffffff;
              if (uVar79 < 4) {
                uVar65 = (&DAT_00158240)[uVar79];
              }
              if (uVar80 < 4) {
                uVar78 = (&DAT_00158240)[uVar80];
              }
              if (uVar82 < 3) {
                uVar58 = *puVar86;
              }
              else {
                uVar58 = 0;
              }
              xmlNodeDumpOutput(lVar57,pxVar88,pxVar61,uVar65,uVar78,uVar58);
              call_tests = call_tests + 1;
              iVar6 = extraout_EDX_34;
              if (lVar57 != 0) {
                xmlOutputBufferClose(lVar57);
                iVar6 = extraout_EDX_35;
              }
              if (((pxVar88 != (xmlDocPtr)0x0) && (api_doc != pxVar88)) && (pxVar88->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar88);
                iVar6 = extraout_EDX_36;
              }
              des_xmlNodePtr(iVar8,pxVar61,iVar6);
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar5 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNodeDumpOutput",(ulong)(uint)(iVar6 - iVar5));
                iVar3 = iVar3 + 1;
                printf(" %d",(ulong)(uint)test_ret_4);
                printf(" %d",(ulong)uVar72);
                printf(" %d",uVar76);
                printf(" %d",(ulong)uVar79);
                printf(" %d",(ulong)uVar80);
                pxVar61 = (xmlNodePtr)(ulong)uVar82;
                printf(" %d");
                putchar(10);
              }
              uVar82 = uVar82 + 1;
              puVar86 = puVar86 + 1;
            } while (uVar82 != 4);
            uVar80 = uVar80 + 1;
          } while (uVar80 != 4);
          uVar79 = uVar79 + 1;
        } while (uVar79 != 4);
        uVar76 = (ulong)(iVar8 + 1U);
      } while (iVar8 + 1U != 3);
      uVar72 = uVar72 + 1;
    } while (uVar72 != 4);
    test_ret_4 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    puVar86 = &DAT_0015ad60;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      if (uVar79 < 4) {
        uVar77 = *puVar86;
      }
      else {
        uVar77 = 0;
      }
      xmlNodeGetAttrValue(0,uVar58,uVar77,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar6 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeGetAttrValue",(ulong)(uint)(iVar8 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  lVar57 = xmlNodeGetBase(0);
  if (lVar57 != 0) {
    (*_xmlFree)(lVar57);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar6 != iVar8) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetBase");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = xmlMemBlocks();
  xmlNodeGetBaseSafe(0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar10 = xmlMemBlocks();
  if (iVar9 != iVar10) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetBaseSafe");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  lVar57 = xmlNodeGetContent(0);
  puVar67 = &DAT_00158240;
  if (lVar57 != 0) {
    (*_xmlFree)(lVar57);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar23 = xmlMemBlocks();
  if (iVar11 != iVar23) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetContent");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar73 = xmlMemBlocks();
  lVar57 = xmlNodeGetLang(0);
  if (lVar57 != 0) {
    (*_xmlFree)(lVar57);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar73 != iVar12) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetLang");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  xmlNodeGetSpacePreserve(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar13 = xmlMemBlocks();
  if (iVar14 != iVar13) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeGetSpacePreserve");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  xmlNodeIsText(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNodeIsText");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    pxVar88 = (xmlDocPtr)0x0;
    lVar57 = xmlNodeListGetRawString(0,0,*puVar67);
    if (lVar57 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNodeListGetRawString",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",0);
      printf(" %d",0);
      pxVar88 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar67 = puVar67 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  test_ret = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar19 = (int)pxVar88;
      iVar18 = xmlMemBlocks();
      pxVar59 = gen_xmlDocPtr(uVar72,iVar19);
      pxVar88 = (xmlDocPtr)0x0;
      lVar57 = xmlNodeListGetString(pxVar59,0,*puVar67);
      if (lVar57 != 0) {
        (*_xmlFree)(lVar57);
      }
      call_tests = call_tests + 1;
      if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
        xmlFreeDoc(pxVar59);
      }
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      iVar20 = (int)pxVar55;
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeListGetString",(ulong)(uint)(iVar19 - iVar18));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = iVar20 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar20 = (int)pxVar88;
      iVar19 = xmlMemBlocks();
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar20);
      uVar79 = (uint)pxVar55;
      if (uVar79 < 4) {
        uVar58 = *puVar86;
      }
      else {
        uVar58 = 0;
      }
      xmlNodeSetBase(pxVar88,uVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_12);
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      if (iVar19 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetBase",(ulong)(uint)(iVar20 - iVar19));
        iVar18 = iVar18 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = uVar79 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar19 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar21 = (int)pxVar88;
      iVar20 = xmlMemBlocks();
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar21);
      uVar79 = (uint)pxVar55;
      if (uVar79 < 4) {
        uVar58 = *puVar86;
      }
      else {
        uVar58 = 0;
      }
      xmlNodeSetContent(pxVar88,uVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_13);
      xmlResetLastError();
      iVar21 = xmlMemBlocks();
      if (iVar20 != iVar21) {
        iVar21 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetContent",(ulong)(uint)(iVar21 - iVar20));
        iVar19 = iVar19 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = uVar79 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  iVar20 = 0;
  do {
    uVar76 = 0;
    do {
      pxVar55 = (xmlDocPtr)0x0;
      piVar87 = &DAT_00158240;
      do {
        iVar24 = (int)pxVar88;
        iVar21 = xmlMemBlocks();
        pxVar88 = (xmlDocPtr)gen_xmlNodePtr(iVar20,iVar24);
        switch(uVar76) {
        case 0:
          bVar1 = false;
          pcVar63 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar63 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar63 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar63 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar63 = (char *)0x0;
        }
        iVar24 = *piVar87;
        if ((!bVar1) && (iVar25 = xmlStrlen(pcVar63), iVar25 < iVar24)) {
          iVar24 = 0;
        }
        xmlNodeSetContentLen(pxVar88,pcVar63,iVar24);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar20,(xmlNodePtr)pxVar88,nr_14);
        xmlResetLastError();
        iVar24 = xmlMemBlocks();
        iVar25 = (int)pxVar55;
        if (iVar21 != iVar24) {
          iVar24 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeSetContentLen",(ulong)(uint)(iVar24 - iVar21));
          test_ret_5 = test_ret_5 + 1;
          printf(" %d",iVar20);
          printf(" %d",uVar76);
          printf(" %d");
          putchar(10);
          pxVar88 = pxVar55;
        }
        uVar72 = iVar25 + 1;
        pxVar55 = (xmlDocPtr)(ulong)uVar72;
        piVar87 = piVar87 + 1;
      } while (uVar72 != 4);
      uVar72 = (int)uVar76 + 1;
      uVar76 = (ulong)uVar72;
    } while (uVar72 != 5);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 3);
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar24 = (int)pxVar88;
      iVar21 = xmlMemBlocks();
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar24);
      uVar79 = (uint)pxVar55;
      if (uVar79 < 4) {
        uVar58 = *puVar86;
      }
      else {
        uVar58 = 0;
      }
      xmlNodeSetLang(pxVar88,uVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_15);
      xmlResetLastError();
      iVar24 = xmlMemBlocks();
      if (iVar21 != iVar24) {
        iVar24 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetLang",(ulong)(uint)(iVar24 - iVar21));
        iVar20 = iVar20 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = uVar79 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar21 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar25 = (int)pxVar88;
      iVar24 = xmlMemBlocks();
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar25);
      uVar79 = (uint)pxVar55;
      if (uVar79 < 4) {
        uVar58 = *puVar86;
      }
      else {
        uVar58 = 0;
      }
      xmlNodeSetName(pxVar88,uVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_16);
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar24 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetName",(ulong)(uint)(iVar25 - iVar24));
        iVar21 = iVar21 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = uVar79 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar24 = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar26 = (int)pxVar88;
      iVar25 = xmlMemBlocks();
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar26);
      xmlNodeSetSpacePreserve(pxVar88,*puVar67);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_17);
      xmlResetLastError();
      iVar26 = xmlMemBlocks();
      iVar75 = (int)pxVar55;
      if (iVar25 != iVar26) {
        iVar26 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetSpacePreserve",(ulong)(uint)(iVar26 - iVar25));
        iVar24 = iVar24 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = iVar75 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar25 = 0;
  do {
    iVar75 = (int)pxVar88;
    iVar26 = xmlMemBlocks();
    pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar75);
    pxVar53 = (xmlNodePtr)xmlPreviousElementSibling(pxVar88);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_18);
    xmlResetLastError();
    iVar75 = xmlMemBlocks();
    if (iVar26 != iVar75) {
      iVar75 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPreviousElementSibling",(ulong)(uint)(iVar75 - iVar26));
      iVar25 = iVar25 + 1;
      pxVar88 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar26 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      iVar75 = (int)pxVar88;
      iVar83 = xmlMemBlocks();
      pxVar55 = gen_xmlDocPtr(uVar72,iVar75);
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar79,iVar75);
      xmlReconciliateNs(pxVar55,pxVar88);
      call_tests = call_tests + 1;
      iVar75 = extraout_EDX_37;
      if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
        xmlFreeDoc(pxVar55);
        iVar75 = extraout_EDX_38;
      }
      des_xmlNodePtr(uVar79,(xmlNodePtr)pxVar88,iVar75);
      xmlResetLastError();
      iVar75 = xmlMemBlocks();
      if (iVar83 != iVar75) {
        iVar75 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReconciliateNs",(ulong)(uint)(iVar75 - iVar83));
        iVar26 = iVar26 + 1;
        printf(" %d",(ulong)uVar72);
        pxVar88 = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar75 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    iVar83 = xmlMemBlocks();
    pxVar56 = gen_xmlAttrPtr(uVar72,(int)pxVar88);
    xmlRemoveProp(pxVar56);
    call_tests = call_tests + 1;
    if (bVar70) {
      xmlFreeDoc(api_doc);
      api_doc = (xmlDocPtr)0x0;
      api_dtd = (xmlDtdPtr)0x0;
      api_root = (xmlNodePtr)0x0;
      api_ns = (xmlNsPtr)0x0;
    }
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar83 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRemoveProp",(ulong)(uint)(iVar27 - iVar83));
      iVar75 = iVar75 + 1;
      pxVar88 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
    uVar72 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar83 = 0;
  do {
    uVar79 = 0;
    do {
      iVar28 = (int)pxVar88;
      iVar27 = xmlMemBlocks();
      pxVar53 = gen_xmlNodePtr(uVar72,iVar28);
      if (uVar79 == 0) {
        pxVar55 = (xmlDocPtr)xmlNewPI("test",0);
        pxVar88 = pxVar55;
        xmlReplaceNode(pxVar53);
        if (pxVar55 != (xmlDocPtr)0x0) {
          xmlUnlinkNode(pxVar55);
          xmlFreeNode(pxVar55);
        }
      }
      else {
        pxVar88 = (xmlDocPtr)0x0;
        xmlReplaceNode(pxVar53);
      }
      if (pxVar53 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar53);
        xmlFreeNode(pxVar53);
      }
      call_tests = call_tests + 1;
      if (uVar72 == 1) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar28 = xmlMemBlocks();
      if (iVar27 != iVar28) {
        iVar28 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReplaceNode",(ulong)(uint)(iVar28 - iVar27));
        iVar83 = iVar83 + 1;
        printf(" %d",(ulong)uVar72);
        pxVar88 = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      iVar29 = (int)pxVar88;
      iVar28 = xmlMemBlocks();
      if (uVar72 < 5) {
        puVar69 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar72];
      }
      else {
        puVar69 = (undefined *)0x0;
      }
      pxVar55 = gen_xmlDocPtr(uVar79,iVar29);
      pxVar88 = pxVar55;
      xmlSaveFile(puVar69);
      call_tests = call_tests + 1;
      if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
        xmlFreeDoc(pxVar55);
      }
      xmlResetLastError();
      iVar29 = xmlMemBlocks();
      if (iVar28 != iVar29) {
        iVar29 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveFile",(ulong)(uint)(iVar29 - iVar28));
        iVar27 = iVar27 + 1;
        printf(" %d",(ulong)uVar72);
        pxVar88 = (xmlDocPtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 6);
  function_tests = function_tests + 1;
  iVar28 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar55 = (xmlDocPtr)0x0;
      puVar86 = &DAT_0015ad48;
      do {
        iVar30 = (int)pxVar88;
        iVar29 = xmlMemBlocks();
        if (uVar72 < 5) {
          puVar69 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar72];
        }
        else {
          puVar69 = (undefined *)0x0;
        }
        pxVar59 = gen_xmlDocPtr(uVar79,iVar30);
        uVar80 = (uint)pxVar55;
        if (uVar80 < 3) {
          uVar58 = *puVar86;
        }
        else {
          uVar58 = 0;
        }
        pxVar88 = pxVar59;
        xmlSaveFileEnc(puVar69,pxVar59,uVar58);
        call_tests = call_tests + 1;
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
        }
        xmlResetLastError();
        iVar30 = xmlMemBlocks();
        if (iVar29 != iVar30) {
          iVar30 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileEnc",(ulong)(uint)(iVar30 - iVar29));
          iVar28 = iVar28 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar88 = pxVar55;
        }
        uVar80 = uVar80 + 1;
        pxVar55 = (xmlDocPtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 4);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 6);
  function_tests = function_tests + 1;
  iVar29 = 0;
  _test_ret_2 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    uVar72 = 0;
    do {
      pxVar55 = (xmlDocPtr)0x0;
      puVar86 = &DAT_0015ad48;
      do {
        iVar31 = (int)pxVar88;
        iVar30 = xmlMemBlocks();
        if (bVar70) {
          iVar31 = 0;
          uVar58 = xmlOutputBufferCreateFilename("test.out",0,0);
        }
        else {
          uVar58 = 0;
        }
        pxVar59 = gen_xmlDocPtr(uVar72,iVar31);
        uVar79 = (uint)pxVar55;
        if (uVar79 < 3) {
          uVar77 = *puVar86;
        }
        else {
          uVar77 = 0;
        }
        pxVar88 = pxVar59;
        xmlSaveFileTo(uVar58,pxVar59,uVar77);
        call_tests = call_tests + 1;
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
        }
        xmlResetLastError();
        iVar31 = xmlMemBlocks();
        if (iVar30 != iVar31) {
          iVar31 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileTo",(ulong)(uint)(iVar31 - iVar30));
          iVar29 = iVar29 + 1;
          printf(" %d",_test_ret_2);
          printf(" %d",(ulong)uVar72);
          printf(" %d");
          putchar(10);
          pxVar88 = pxVar55;
        }
        uVar79 = uVar79 + 1;
        pxVar55 = (xmlDocPtr)(ulong)uVar79;
        puVar86 = puVar86 + 1;
      } while (uVar79 != 4);
      uVar72 = uVar72 + 1;
    } while (uVar72 != 4);
    _test_ret_2 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  iVar30 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      puVar67 = &DAT_00158240;
      uVar80 = 0;
      do {
        iVar32 = (int)pxVar88;
        iVar31 = xmlMemBlocks();
        if (uVar72 < 5) {
          puVar69 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar72];
        }
        else {
          puVar69 = (undefined *)0x0;
        }
        pxVar55 = gen_xmlDocPtr(uVar79,iVar32);
        pxVar88 = pxVar55;
        xmlSaveFormatFile(puVar69,pxVar55,*puVar67);
        call_tests = call_tests + 1;
        if (((pxVar55 != (xmlDocPtr)0x0) && (api_doc != pxVar55)) && (pxVar55->doc != api_doc)) {
          xmlFreeDoc(pxVar55);
        }
        xmlResetLastError();
        iVar32 = xmlMemBlocks();
        if (iVar31 != iVar32) {
          iVar32 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFormatFile",(ulong)(uint)(iVar32 - iVar31));
          iVar30 = iVar30 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          pxVar88 = (xmlDocPtr)(ulong)uVar80;
          printf(" %d");
          putchar(10);
        }
        uVar80 = uVar80 + 1;
        puVar67 = puVar67 + 1;
      } while (uVar80 != 4);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 6);
  function_tests = function_tests + 1;
  iVar31 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      uVar80 = 0;
      do {
        puVar67 = &DAT_00158240;
        pxVar55 = (xmlDocPtr)0x0;
        do {
          iVar33 = (int)pxVar88;
          iVar32 = xmlMemBlocks();
          if (uVar72 < 5) {
            puVar69 = (&PTR_anon_var_dwarf_67f_0015ad20)[uVar72];
          }
          else {
            puVar69 = (undefined *)0x0;
          }
          pxVar59 = gen_xmlDocPtr(uVar79,iVar33);
          if (uVar80 < 3) {
            uVar58 = (&DAT_0015ad48)[uVar80];
          }
          else {
            uVar58 = 0;
          }
          pxVar88 = pxVar59;
          xmlSaveFormatFileEnc(puVar69,pxVar59,uVar58,*puVar67);
          call_tests = call_tests + 1;
          if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
            xmlFreeDoc(pxVar59);
          }
          xmlResetLastError();
          iVar33 = xmlMemBlocks();
          iVar34 = (int)pxVar55;
          if (iVar32 != iVar33) {
            iVar33 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileEnc",(ulong)(uint)(iVar33 - iVar32))
            ;
            iVar31 = iVar31 + 1;
            printf(" %d",(ulong)uVar72);
            printf(" %d",(ulong)uVar79);
            printf(" %d",(ulong)uVar80);
            printf(" %d");
            putchar(10);
            pxVar88 = pxVar55;
          }
          uVar82 = iVar34 + 1;
          pxVar55 = (xmlDocPtr)(ulong)uVar82;
          puVar67 = puVar67 + 1;
        } while (uVar82 != 4);
        uVar80 = uVar80 + 1;
      } while (uVar80 != 4);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 6);
  function_tests = function_tests + 1;
  iVar32 = 0;
  _test_ret_27 = 0;
  bVar1 = true;
  do {
    bVar70 = bVar1;
    uVar72 = 0;
    do {
      uVar76 = 0;
      do {
        puVar67 = &DAT_00158240;
        pxVar55 = (xmlDocPtr)0x0;
        do {
          iVar34 = (int)pxVar88;
          iVar33 = xmlMemBlocks();
          if (bVar70) {
            iVar34 = 0;
            uVar58 = xmlOutputBufferCreateFilename("test.out",0,0);
          }
          else {
            uVar58 = 0;
          }
          pxVar59 = gen_xmlDocPtr(uVar72,iVar34);
          if ((uint)uVar76 < 3) {
            uVar77 = (&DAT_0015ad48)[uVar76];
          }
          else {
            uVar77 = 0;
          }
          pxVar88 = pxVar59;
          xmlSaveFormatFileTo(uVar58,pxVar59,uVar77,*puVar67);
          call_tests = call_tests + 1;
          if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
            xmlFreeDoc(pxVar59);
          }
          xmlResetLastError();
          iVar34 = xmlMemBlocks();
          iVar35 = (int)pxVar55;
          if (iVar33 != iVar34) {
            iVar34 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileTo",(ulong)(uint)(iVar34 - iVar33));
            iVar32 = iVar32 + 1;
            printf(" %d",_test_ret_27);
            printf(" %d",(ulong)uVar72);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pxVar88 = pxVar55;
          }
          uVar79 = iVar35 + 1;
          pxVar55 = (xmlDocPtr)(ulong)uVar79;
          puVar67 = puVar67 + 1;
        } while (uVar79 != 4);
        uVar79 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar79;
      } while (uVar79 != 4);
      uVar72 = uVar72 + 1;
    } while (uVar72 != 4);
    _test_ret_27 = 1;
    bVar1 = false;
  } while (bVar70);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      puVar86 = &DAT_0015ad60;
      pxVar55 = (xmlDocPtr)0x0;
      do {
        iVar34 = (int)pxVar88;
        iVar33 = xmlMemBlocks();
        pxVar59 = gen_xmlDocPtr(uVar72,iVar34);
        pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar79,iVar34);
        uVar80 = (uint)pxVar55;
        if (uVar80 < 4) {
          uVar58 = *puVar86;
        }
        else {
          uVar58 = 0;
        }
        xmlSearchNs(pxVar59,pxVar88,uVar58);
        call_tests = call_tests + 1;
        iVar34 = extraout_EDX_39;
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
          iVar34 = extraout_EDX_40;
        }
        des_xmlNodePtr(uVar79,(xmlNodePtr)pxVar88,iVar34);
        xmlResetLastError();
        iVar34 = xmlMemBlocks();
        if (iVar33 != iVar34) {
          iVar34 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNs",(ulong)(uint)(iVar34 - iVar33));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar88 = pxVar55;
        }
        uVar80 = uVar80 + 1;
        pxVar55 = (xmlDocPtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar33 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar55 = (xmlDocPtr)0x0;
      puVar86 = &DAT_0015ad60;
      do {
        iVar35 = (int)pxVar88;
        iVar34 = xmlMemBlocks();
        pxVar59 = gen_xmlDocPtr(uVar72,iVar35);
        pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar79,iVar35);
        uVar80 = (uint)pxVar55;
        if (uVar80 < 4) {
          uVar58 = *puVar86;
        }
        else {
          uVar58 = 0;
        }
        xmlSearchNsByHref(pxVar59,pxVar88,uVar58);
        call_tests = call_tests + 1;
        iVar35 = extraout_EDX_41;
        if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
          xmlFreeDoc(pxVar59);
          iVar35 = extraout_EDX_42;
        }
        des_xmlNodePtr(uVar79,(xmlNodePtr)pxVar88,iVar35);
        xmlResetLastError();
        iVar35 = xmlMemBlocks();
        if (iVar34 != iVar35) {
          iVar35 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNsByHref",(ulong)(uint)(iVar35 - iVar34));
          iVar33 = iVar33 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar88 = pxVar55;
        }
        uVar80 = uVar80 + 1;
        pxVar55 = (xmlDocPtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  uVar72 = 0xffffffff;
  iVar34 = 0;
  do {
    iVar35 = xmlMemBlocks();
    uVar65 = 0;
    if (uVar72 < 3) {
      uVar65 = (&DAT_0014c1f8)[uVar72];
    }
    uVar72 = uVar72 + 1;
    xmlSetBufferAllocationScheme(uVar65);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar36 = xmlMemBlocks();
    if (iVar35 != iVar36) {
      iVar36 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetBufferAllocationScheme",
             (ulong)(uint)(iVar36 - iVar35));
      iVar34 = iVar34 + 1;
      pxVar88 = (xmlDocPtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar22 = iVar28 + iVar29 +
           iVar20 + iVar21 +
           iVar18 + iVar19 +
           test_ret_17 + iVar7 + iVar2 + iVar22 + iVar4 + test_ret_28 + iVar3 + iVar5 +
           (uint)(iVar6 != iVar8) + (uint)(iVar9 != iVar10) + (uint)(iVar11 != iVar23) +
           (uint)(iVar73 != iVar12) + (uint)(iVar14 != iVar13) + (uint)(iVar15 != iVar16) + iVar17 +
           test_ret + test_ret_5 + iVar24 + iVar25 + iVar26 + iVar75 + iVar83 + iVar27 + iVar30 +
           iVar31 + iVar32 + test_ret_2;
  puVar67 = &DAT_00158240;
  pxVar55 = (xmlDocPtr)0x0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    xmlSetCompressMode(*puVar67);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    iVar5 = (int)pxVar55;
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetCompressMode",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d");
      putchar(10);
      pxVar88 = pxVar55;
    }
    uVar72 = iVar5 + 1;
    pxVar55 = (xmlDocPtr)(ulong)uVar72;
    puVar67 = puVar67 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar72 = 0;
  do {
    puVar84 = &DAT_00158240;
    pxVar55 = (xmlDocPtr)0x0;
    do {
      iVar4 = (int)pxVar88;
      iVar3 = xmlMemBlocks();
      pxVar59 = gen_xmlDocPtr(uVar72,iVar4);
      pxVar88 = (xmlDocPtr)(ulong)*puVar84;
      xmlSetDocCompressMode(pxVar59);
      call_tests = call_tests + 1;
      if (((pxVar59 != (xmlDocPtr)0x0) && (api_doc != pxVar59)) && (pxVar59->doc != api_doc)) {
        xmlFreeDoc(pxVar59);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      iVar5 = (int)pxVar55;
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetDocCompressMode",(ulong)(uint)(iVar4 - iVar3));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      uVar79 = iVar5 + 1;
      pxVar55 = (xmlDocPtr)(ulong)uVar79;
      puVar84 = puVar84 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar72 = 0;
  do {
    pxVar55 = (xmlDocPtr)0x0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      iVar5 = (int)pxVar88;
      iVar4 = xmlMemBlocks();
      pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar5);
      if (bVar70) {
        get_api_root();
        if (api_root != (xmlNodePtr)0x0) {
          api_ns = api_root->nsDef;
        }
        xmlSetNs(pxVar88,api_ns);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_20);
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      else {
        xmlSetNs(pxVar88,0);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,nr_19);
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetNs",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pxVar88 = pxVar55;
      }
      pxVar55 = (xmlDocPtr)0x1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar5 = 0;
  do {
    _test_ret_27 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      uVar76 = 0;
      do {
        puVar86 = &DAT_0015ad60;
        pxVar55 = (xmlDocPtr)0x0;
        do {
          iVar7 = (int)pxVar88;
          iVar6 = xmlMemBlocks();
          pxVar88 = (xmlDocPtr)gen_xmlNodePtr(iVar5,iVar7);
          if (bVar70) {
            get_api_root();
            pxVar68 = api_ns;
            if (api_root != (xmlNodePtr)0x0) {
              api_ns = api_root->nsDef;
              pxVar68 = api_ns;
            }
          }
          else {
            pxVar68 = (xmlNs *)0x0;
          }
          if ((uint)uVar76 < 4) {
            uVar58 = (&DAT_0015ad60)[uVar76];
          }
          else {
            uVar58 = 0;
          }
          uVar72 = (uint)pxVar55;
          if (uVar72 < 4) {
            uVar77 = *puVar86;
          }
          else {
            uVar77 = 0;
          }
          auVar89 = xmlSetNsProp(pxVar88,pxVar68,uVar58,uVar77);
          iVar7 = auVar89._8_4_;
          lVar57 = auVar89._0_8_;
          if (lVar57 != 0) {
            xmlUnlinkNode(lVar57);
            xmlFreeNode(lVar57);
            iVar7 = extraout_EDX_43;
          }
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar5,(xmlNodePtr)pxVar88,iVar7);
          if (bVar70) {
            xmlFreeDoc(api_doc);
            api_doc = (xmlDocPtr)0x0;
            api_dtd = (xmlDtdPtr)0x0;
            api_root = (xmlNodePtr)0x0;
            api_ns = (xmlNsPtr)0x0;
          }
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSetNsProp",(ulong)(uint)(iVar7 - iVar6));
            iVar4 = iVar4 + 1;
            printf(" %d",iVar5);
            printf(" %d",_test_ret_27);
            printf(" %d",uVar76);
            printf(" %d");
            putchar(10);
            pxVar88 = pxVar55;
          }
          uVar72 = uVar72 + 1;
          pxVar55 = (xmlDocPtr)(ulong)uVar72;
          puVar86 = puVar86 + 1;
        } while (uVar72 != 5);
        uVar72 = (uint)uVar76 + 1;
        uVar76 = (ulong)uVar72;
      } while (uVar72 != 5);
      _test_ret_27 = 1;
      bVar1 = false;
    } while (bVar70);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    do {
      pxVar55 = (xmlDocPtr)0x0;
      puVar86 = &DAT_0015ad60;
      do {
        iVar6 = (int)pxVar88;
        iVar5 = xmlMemBlocks();
        pxVar88 = (xmlDocPtr)gen_xmlNodePtr(uVar72,iVar6);
        if (uVar79 < 4) {
          uVar58 = (&DAT_0015ad60)[uVar79];
        }
        else {
          uVar58 = 0;
        }
        uVar80 = (uint)pxVar55;
        if (uVar80 < 4) {
          uVar77 = *puVar86;
        }
        else {
          uVar77 = 0;
        }
        auVar89 = xmlSetProp(pxVar88,uVar58,uVar77);
        iVar6 = auVar89._8_4_;
        lVar57 = auVar89._0_8_;
        if (lVar57 != 0) {
          xmlUnlinkNode(lVar57);
          xmlFreeNode(lVar57);
          iVar6 = extraout_EDX_44;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,(xmlNodePtr)pxVar88,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetProp",(ulong)(uint)(iVar6 - iVar5));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",(ulong)uVar79);
          printf(" %d");
          putchar(10);
          pxVar88 = pxVar55;
        }
        uVar80 = uVar80 + 1;
        pxVar55 = (xmlDocPtr)(ulong)uVar80;
        puVar86 = puVar86 + 1;
      } while (uVar80 != 5);
      uVar79 = uVar79 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  puVar86 = &DAT_0015ad60;
  iVar5 = 0;
  uVar72 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar72 < 4) {
      uVar58 = *puVar86;
    }
    else {
      uVar58 = 0;
    }
    lVar57 = xmlSplitQName2(uVar58,0);
    if (lVar57 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSplitQName2",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    puVar86 = puVar86 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  _test_ret = &DAT_0015ad60;
  iVar6 = 0;
  uVar72 = 0;
  do {
    uVar79 = 0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      iVar7 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      uVar77 = 0;
      if (bVar70) {
        uVar77 = 0x15d434;
      }
      xmlSplitQName3(uVar58,uVar77);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSplitQName3",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",(ulong)uVar79);
        putchar(10);
      }
      uVar79 = 1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  iVar22 = iVar33 + iVar34 + iVar22 + iVar2 + test_ret_4 + iVar3 + iVar4 + test_ret_2;
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar72 < 4) {
      uVar58 = *_test_ret;
    }
    else {
      uVar58 = 0;
    }
    pxVar53 = (xmlNodePtr)xmlStringGetNodeList(0,uVar58);
    desret_xmlNodePtr(pxVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStringGetNodeList",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar72 = uVar72 + 1;
    _test_ret = _test_ret + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  uVar72 = 0;
  test_ret_2 = 0;
  do {
    piVar87 = &DAT_00158240;
    pxVar53 = (xmlNodePtr)0x0;
    do {
      iVar3 = xmlMemBlocks();
      switch(uVar72) {
      case 0:
        bVar1 = false;
        pcVar63 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar63 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar63 = anon_var_dwarf_19f;
        break;
      case 3:
        bVar1 = false;
        pcVar63 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar63 = (char *)0x0;
      }
      iVar4 = *piVar87;
      if ((!bVar1) && (iVar7 = xmlStrlen(pcVar63), iVar7 < iVar4)) {
        iVar4 = 0;
      }
      pxVar61 = (xmlNodePtr)xmlStringLenGetNodeList(0,pcVar63,iVar4);
      desret_xmlNodePtr(pxVar61);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      iVar7 = (int)pxVar53;
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStringLenGetNodeList",(ulong)(uint)(iVar4 - iVar3));
        test_ret_2 = test_ret_2 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        pcVar63 = (char *)pxVar53;
      }
      uVar79 = iVar7 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      piVar87 = piVar87 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar22 = iVar6 + iVar2 + iVar22 + iVar5 + test_ret_2;
  iVar2 = 0;
  iVar3 = 0;
  do {
    uVar76 = 0;
    do {
      pxVar53 = (xmlNodePtr)0x0;
      piVar87 = &DAT_00158240;
      do {
        iVar5 = (int)pcVar63;
        iVar4 = xmlMemBlocks();
        pcVar63 = (char *)gen_xmlNodePtr(iVar3,iVar5);
        switch(uVar76) {
        case 0:
          bVar1 = false;
          pcVar85 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar85 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar85 = anon_var_dwarf_19f;
          break;
        case 3:
          bVar1 = false;
          pcVar85 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar85 = (char *)0x0;
        }
        iVar5 = *piVar87;
        if ((!bVar1) && (iVar6 = xmlStrlen(pcVar85), iVar6 < iVar5)) {
          iVar5 = 0;
        }
        xmlTextConcat(pcVar63,pcVar85,iVar5);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar3,(xmlNodePtr)pcVar63,nr_21);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        iVar6 = (int)pxVar53;
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlTextConcat",(ulong)(uint)(iVar5 - iVar4));
          iVar2 = iVar2 + 1;
          printf(" %d",iVar3);
          printf(" %d",uVar76);
          printf(" %d");
          putchar(10);
          pcVar63 = (char *)pxVar53;
        }
        uVar72 = iVar6 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar72;
        piVar87 = piVar87 + 1;
      } while (uVar72 != 4);
      uVar72 = (int)uVar76 + 1;
      uVar76 = (ulong)uVar72;
    } while (uVar72 != 5);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0;
  iVar3 = 0;
  do {
    uVar79 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar72 == 0) {
        pxVar53 = (xmlNodePtr)xmlNewPI("test",0);
      }
      else {
        pxVar53 = (xmlNodePtr)0x0;
      }
      if (uVar79 == 0) {
        pxVar61 = (xmlNodePtr)xmlNewPI("test",0);
      }
      else {
        pxVar61 = (xmlNodePtr)0x0;
      }
      val = pxVar61;
      pxVar64 = (xmlNodePtr)xmlTextMerge(pxVar53);
      if (pxVar64 == (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar61);
        xmlFreeNode(pxVar61);
        pxVar64 = pxVar53;
      }
      desret_xmlNodePtr(pxVar64);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlTextMerge",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar72);
        val = (xmlNodePtr)(ulong)uVar79;
        printf(" %d");
        putchar(10);
      }
      uVar79 = uVar79 + 1;
    } while (uVar79 != 3);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  uVar72 = 0xffffffff;
  iVar4 = 0;
  do {
    iVar5 = xmlMemBlocks();
    uVar65 = 0;
    if (uVar72 < 3) {
      uVar65 = (&DAT_0014c1f8)[uVar72];
    }
    uVar72 = uVar72 + 1;
    xmlThrDefBufferAllocScheme(uVar65);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefBufferAllocScheme",(ulong)(uint)(iVar6 - iVar5));
      iVar4 = iVar4 + 1;
      val = (xmlNodePtr)(ulong)uVar72;
      printf(" %d");
      putchar(10);
    }
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  puVar67 = &DAT_00158240;
  pxVar53 = (xmlNodePtr)0x0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    xmlThrDefDefaultBufferSize(*puVar67);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    iVar8 = (int)pxVar53;
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlThrDefDefaultBufferSize",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      putchar(10);
      val = pxVar53;
    }
    uVar72 = iVar8 + 1;
    pxVar53 = (xmlNodePtr)(ulong)uVar72;
    puVar67 = puVar67 + 1;
  } while (uVar72 != 4);
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  uVar72 = 0;
  do {
    _test_ret = (undefined8 *)0x0;
    bVar1 = true;
    do {
      bVar70 = bVar1;
      pxVar53 = (xmlNodePtr)0x0;
      puVar86 = &DAT_0015ad60;
      do {
        iVar7 = (int)val;
        iVar6 = xmlMemBlocks();
        val = gen_xmlNodePtr(uVar72,iVar7);
        if (bVar70) {
          get_api_root();
          pxVar68 = api_ns;
          if (api_root != (xmlNodePtr)0x0) {
            api_ns = api_root->nsDef;
            pxVar68 = api_ns;
          }
        }
        else {
          pxVar68 = (xmlNs *)0x0;
        }
        uVar79 = (uint)pxVar53;
        if (uVar79 < 4) {
          uVar58 = *puVar86;
        }
        else {
          uVar58 = 0;
        }
        xmlUnsetNsProp(val,pxVar68,uVar58);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar72,val,nr_22);
        if (bVar70) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUnsetNsProp",(ulong)(uint)(iVar7 - iVar6));
          test_ret_2 = test_ret_2 + 1;
          printf(" %d",(ulong)uVar72);
          printf(" %d",_test_ret);
          printf(" %d");
          putchar(10);
          val = pxVar53;
        }
        uVar79 = uVar79 + 1;
        pxVar53 = (xmlNodePtr)(ulong)uVar79;
        puVar86 = puVar86 + 1;
      } while (uVar79 != 5);
      _test_ret = (undefined8 *)0x1;
      bVar1 = false;
    } while (bVar70);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar72 = 0;
  do {
    puVar86 = &DAT_0015ad60;
    pxVar53 = (xmlNodePtr)0x0;
    do {
      iVar8 = (int)val;
      iVar7 = xmlMemBlocks();
      val = gen_xmlNodePtr(uVar72,iVar8);
      uVar79 = (uint)pxVar53;
      if (uVar79 < 4) {
        uVar58 = *puVar86;
      }
      else {
        uVar58 = 0;
      }
      xmlUnsetProp(val,uVar58);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar72,val,nr_23);
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUnsetProp",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d");
        putchar(10);
        val = pxVar53;
      }
      uVar79 = uVar79 + 1;
      pxVar53 = (xmlNodePtr)(ulong)uVar79;
      puVar86 = puVar86 + 1;
    } while (uVar79 != 5);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 3);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    uVar79 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      xmlValidateNCName(uVar58,*puVar67);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNCName",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",(ulong)uVar79);
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    uVar79 = 0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      xmlValidateNMToken(uVar58,*puVar67);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNMToken",(ulong)(uint)(iVar10 - iVar9));
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",(ulong)uVar79);
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    uVar79 = 0;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      xmlValidateName(uVar58,*puVar67);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateName",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",(ulong)uVar79);
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar72 = 0;
  do {
    puVar67 = &DAT_00158240;
    uVar79 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar72 < 4) {
        uVar58 = (&DAT_0015ad60)[uVar72];
      }
      else {
        uVar58 = 0;
      }
      xmlValidateQName(uVar58,*puVar67);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      if (iVar11 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateQName",(ulong)(uint)(iVar23 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar72);
        printf(" %d",(ulong)uVar79);
        putchar(10);
      }
      uVar79 = uVar79 + 1;
      puVar67 = puVar67 + 1;
    } while (uVar79 != 4);
    uVar72 = uVar72 + 1;
  } while (uVar72 != 5);
  function_tests = function_tests + 1;
  uVar72 = test_ret_2 + iVar6 + iVar3 + iVar4 + iVar22 + iVar2 + iVar5 + iVar7 + iVar8 + iVar9 +
           iVar10;
  if (uVar72 != 0) {
    printf("Module tree: %d errors\n",(ulong)uVar72);
  }
  return uVar72;
}

Assistant:

static int
test_tree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing tree : 146 of 172 functions ...\n");
    test_ret += test_xmlAddChild();
    test_ret += test_xmlAddChildList();
    test_ret += test_xmlAddNextSibling();
    test_ret += test_xmlAddPrevSibling();
    test_ret += test_xmlAddSibling();
    test_ret += test_xmlAttrSerializeTxtContent();
    test_ret += test_xmlBufContent();
    test_ret += test_xmlBufEnd();
    test_ret += test_xmlBufGetNodeContent();
    test_ret += test_xmlBufNodeDump();
    test_ret += test_xmlBufShrink();
    test_ret += test_xmlBufUse();
    test_ret += test_xmlBufferAdd();
    test_ret += test_xmlBufferAddHead();
    test_ret += test_xmlBufferCCat();
    test_ret += test_xmlBufferCat();
    test_ret += test_xmlBufferContent();
    test_ret += test_xmlBufferCreate();
    test_ret += test_xmlBufferCreateSize();
    test_ret += test_xmlBufferCreateStatic();
    test_ret += test_xmlBufferDetach();
    test_ret += test_xmlBufferEmpty();
    test_ret += test_xmlBufferGrow();
    test_ret += test_xmlBufferLength();
    test_ret += test_xmlBufferResize();
    test_ret += test_xmlBufferSetAllocationScheme();
    test_ret += test_xmlBufferShrink();
    test_ret += test_xmlBufferWriteCHAR();
    test_ret += test_xmlBufferWriteChar();
    test_ret += test_xmlBufferWriteQuotedString();
    test_ret += test_xmlBuildQName();
    test_ret += test_xmlChildElementCount();
    test_ret += test_xmlCopyDoc();
    test_ret += test_xmlCopyDtd();
    test_ret += test_xmlCopyNamespace();
    test_ret += test_xmlCopyNamespaceList();
    test_ret += test_xmlCopyNode();
    test_ret += test_xmlCopyNodeList();
    test_ret += test_xmlCopyProp();
    test_ret += test_xmlCopyPropList();
    test_ret += test_xmlCreateIntSubset();
    test_ret += test_xmlDOMWrapAdoptNode();
    test_ret += test_xmlDOMWrapCloneNode();
    test_ret += test_xmlDOMWrapNewCtxt();
    test_ret += test_xmlDOMWrapReconcileNamespaces();
    test_ret += test_xmlDOMWrapRemoveNode();
    test_ret += test_xmlDeregisterNodeDefault();
    test_ret += test_xmlDocCopyNode();
    test_ret += test_xmlDocCopyNodeList();
    test_ret += test_xmlDocDump();
    test_ret += test_xmlDocDumpFormatMemory();
    test_ret += test_xmlDocDumpFormatMemoryEnc();
    test_ret += test_xmlDocDumpMemory();
    test_ret += test_xmlDocDumpMemoryEnc();
    test_ret += test_xmlDocFormatDump();
    test_ret += test_xmlDocGetRootElement();
    test_ret += test_xmlDocSetRootElement();
    test_ret += test_xmlElemDump();
    test_ret += test_xmlFirstElementChild();
    test_ret += test_xmlGetBufferAllocationScheme();
    test_ret += test_xmlGetCompressMode();
    test_ret += test_xmlGetDocCompressMode();
    test_ret += test_xmlGetIntSubset();
    test_ret += test_xmlGetLastChild();
    test_ret += test_xmlGetLineNo();
    test_ret += test_xmlGetNoNsProp();
    test_ret += test_xmlGetNodePath();
    test_ret += test_xmlGetNsList();
    test_ret += test_xmlGetNsListSafe();
    test_ret += test_xmlGetNsProp();
    test_ret += test_xmlGetProp();
    test_ret += test_xmlHasNsProp();
    test_ret += test_xmlHasProp();
    test_ret += test_xmlIsBlankNode();
    test_ret += test_xmlIsXHTML();
    test_ret += test_xmlLastElementChild();
    test_ret += test_xmlNewCDataBlock();
    test_ret += test_xmlNewCharRef();
    test_ret += test_xmlNewChild();
    test_ret += test_xmlNewComment();
    test_ret += test_xmlNewDoc();
    test_ret += test_xmlNewDocComment();
    test_ret += test_xmlNewDocFragment();
    test_ret += test_xmlNewDocNode();
    test_ret += test_xmlNewDocNodeEatName();
    test_ret += test_xmlNewDocPI();
    test_ret += test_xmlNewDocProp();
    test_ret += test_xmlNewDocRawNode();
    test_ret += test_xmlNewDocText();
    test_ret += test_xmlNewDocTextLen();
    test_ret += test_xmlNewDtd();
    test_ret += test_xmlNewNode();
    test_ret += test_xmlNewNodeEatName();
    test_ret += test_xmlNewNs();
    test_ret += test_xmlNewNsProp();
    test_ret += test_xmlNewNsPropEatName();
    test_ret += test_xmlNewPI();
    test_ret += test_xmlNewProp();
    test_ret += test_xmlNewReference();
    test_ret += test_xmlNewText();
    test_ret += test_xmlNewTextChild();
    test_ret += test_xmlNewTextLen();
    test_ret += test_xmlNextElementSibling();
    test_ret += test_xmlNodeAddContent();
    test_ret += test_xmlNodeAddContentLen();
    test_ret += test_xmlNodeBufGetContent();
    test_ret += test_xmlNodeDump();
    test_ret += test_xmlNodeDumpOutput();
    test_ret += test_xmlNodeGetAttrValue();
    test_ret += test_xmlNodeGetBase();
    test_ret += test_xmlNodeGetBaseSafe();
    test_ret += test_xmlNodeGetContent();
    test_ret += test_xmlNodeGetLang();
    test_ret += test_xmlNodeGetSpacePreserve();
    test_ret += test_xmlNodeIsText();
    test_ret += test_xmlNodeListGetRawString();
    test_ret += test_xmlNodeListGetString();
    test_ret += test_xmlNodeSetBase();
    test_ret += test_xmlNodeSetContent();
    test_ret += test_xmlNodeSetContentLen();
    test_ret += test_xmlNodeSetLang();
    test_ret += test_xmlNodeSetName();
    test_ret += test_xmlNodeSetSpacePreserve();
    test_ret += test_xmlPreviousElementSibling();
    test_ret += test_xmlReconciliateNs();
    test_ret += test_xmlRegisterNodeDefault();
    test_ret += test_xmlRemoveProp();
    test_ret += test_xmlReplaceNode();
    test_ret += test_xmlSaveFile();
    test_ret += test_xmlSaveFileEnc();
    test_ret += test_xmlSaveFileTo();
    test_ret += test_xmlSaveFormatFile();
    test_ret += test_xmlSaveFormatFileEnc();
    test_ret += test_xmlSaveFormatFileTo();
    test_ret += test_xmlSearchNs();
    test_ret += test_xmlSearchNsByHref();
    test_ret += test_xmlSetBufferAllocationScheme();
    test_ret += test_xmlSetCompressMode();
    test_ret += test_xmlSetDocCompressMode();
    test_ret += test_xmlSetNs();
    test_ret += test_xmlSetNsProp();
    test_ret += test_xmlSetProp();
    test_ret += test_xmlSplitQName2();
    test_ret += test_xmlSplitQName3();
    test_ret += test_xmlStringGetNodeList();
    test_ret += test_xmlStringLenGetNodeList();
    test_ret += test_xmlTextConcat();
    test_ret += test_xmlTextMerge();
    test_ret += test_xmlThrDefBufferAllocScheme();
    test_ret += test_xmlThrDefDefaultBufferSize();
    test_ret += test_xmlThrDefDeregisterNodeDefault();
    test_ret += test_xmlThrDefRegisterNodeDefault();
    test_ret += test_xmlUnsetNsProp();
    test_ret += test_xmlUnsetProp();
    test_ret += test_xmlValidateNCName();
    test_ret += test_xmlValidateNMToken();
    test_ret += test_xmlValidateName();
    test_ret += test_xmlValidateQName();

    if (test_ret != 0)
	printf("Module tree: %d errors\n", test_ret);
    return(test_ret);
}